

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  int *piVar82;
  int iVar83;
  void *pvVar84;
  long lVar85;
  void *pvVar86;
  ulong uVar87;
  long lVar88;
  uint *puVar89;
  int j_2;
  void *pvVar90;
  int iVar91;
  undefined1 (*pauVar92) [32];
  undefined1 (*pauVar93) [16];
  int q;
  int _elempack;
  int iVar94;
  undefined4 *puVar95;
  float *pfVar96;
  ulong uVar97;
  uint *puVar98;
  int iVar99;
  float *pfVar100;
  int iVar101;
  int j;
  undefined1 (*pauVar102) [32];
  long lVar103;
  undefined1 (*pauVar104) [16];
  bool bVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  v4sf one;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 in_ZMM30 [64];
  Mat local_d8;
  void *local_90;
  void *local_88;
  long local_80;
  Mat local_78;
  undefined1 auVar163 [32];
  undefined1 auVar134 [16];
  undefined1 auVar174 [32];
  
  iVar3 = bottom_blob->elempack;
  if ((long)iVar3 == 0x10) {
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    convert_packing(bottom_blob,&local_d8,8,opt);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    (*this->_vptr_Convolution1D_x86_avx512[2])(this,&local_d8,&local_78,opt);
    convert_packing(&local_78,top_blob,0x10,opt);
    piVar82 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar82 != (int *)0x0) {
      LOCK();
      *piVar82 = *piVar82 + -1;
      UNLOCK();
      if (*piVar82 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar82 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar82 != (int *)0x0) {
      LOCK();
      *piVar82 = *piVar82 + -1;
      UNLOCK();
      if (*piVar82 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          free(local_d8.data);
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar94 = 0;
  }
  else {
    uVar87 = bottom_blob->elemsize;
    p_Var5 = this->_vptr_Convolution1D_x86_avx512[-3];
    iVar101 = *(int *)(&this->field_0xd4 + (long)p_Var5);
    iVar99 = *(int *)(&this->field_0xd8 + (long)p_Var5);
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    local_d8.w = local_d8.refcount._4_4_;
    local_d8.h = (uint)local_d8.elemsize;
    Convolution1D::make_padding
              ((Convolution1D *)
               ((long)&this->_vptr_Convolution1D_x86_avx512 +
               (long)this->_vptr_Convolution1D_x86_avx512[-3]),bottom_blob,&local_d8,opt);
    iVar83 = local_d8.h;
    iVar94 = -100;
    if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0)) {
      uVar4 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]);
      if (opt->use_packing_layout == true) {
        lVar85 = 8;
        if ((uVar4 & 7) != 0) {
          lVar85 = (ulong)((uVar4 & 3) == 0) * 3 + 1;
        }
      }
      else {
        lVar85 = 1;
      }
      _elempack = (int)lVar85;
      iVar101 = (local_d8.w + ~((iVar101 + -1) * iVar99)) /
                *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx512[-3]);
      pvVar84 = (void *)((long)(int)uVar4 / (long)_elempack & 0xffffffff);
      iVar99 = (int)((long)(int)uVar4 / (long)_elempack);
      Mat::create(top_blob,iVar101 + 1,iVar99,lVar85 * (uVar87 / (ulong)(long)iVar3),_elempack,
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if ((iVar3 == 8) && (_elempack == 8)) {
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = (void *)0x0;
          if (0 < iVar99) {
            pvVar86 = pvVar84;
          }
          auVar170._8_4_ = 0x42b0c0a5;
          auVar170._0_8_ = 0x42b0c0a542b0c0a5;
          auVar170._12_4_ = 0x42b0c0a5;
          auVar170._16_4_ = 0x42b0c0a5;
          auVar170._20_4_ = 0x42b0c0a5;
          auVar170._24_4_ = 0x42b0c0a5;
          auVar170._28_4_ = 0x42b0c0a5;
          auVar171._8_4_ = 0xc2b0c0a5;
          auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar171._12_4_ = 0xc2b0c0a5;
          auVar171._16_4_ = 0xc2b0c0a5;
          auVar171._20_4_ = 0xc2b0c0a5;
          auVar171._24_4_ = 0xc2b0c0a5;
          auVar171._28_4_ = 0xc2b0c0a5;
          auVar172._8_4_ = 0x3f000000;
          auVar172._0_8_ = 0x3f0000003f000000;
          auVar172._12_4_ = 0x3f000000;
          auVar172._16_4_ = 0x3f000000;
          auVar172._20_4_ = 0x3f000000;
          auVar172._24_4_ = 0x3f000000;
          auVar172._28_4_ = 0x3f000000;
          auVar182._8_4_ = 0x3fb8aa3b;
          auVar182._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar182._12_4_ = 0x3fb8aa3b;
          auVar182._16_4_ = 0x3fb8aa3b;
          auVar182._20_4_ = 0x3fb8aa3b;
          auVar182._24_4_ = 0x3fb8aa3b;
          auVar182._28_4_ = 0x3fb8aa3b;
          auVar176._8_4_ = 0x3f800000;
          auVar176._0_8_ = 0x3f8000003f800000;
          auVar176._12_4_ = 0x3f800000;
          auVar176._16_4_ = 0x3f800000;
          auVar176._20_4_ = 0x3f800000;
          auVar176._24_4_ = 0x3f800000;
          auVar176._28_4_ = 0x3f800000;
          auVar174._8_4_ = 0x3f318000;
          auVar174._0_8_ = 0x3f3180003f318000;
          auVar174._12_4_ = 0x3f318000;
          auVar174._16_4_ = 0x3f318000;
          auVar174._20_4_ = 0x3f318000;
          auVar174._24_4_ = 0x3f318000;
          auVar174._28_4_ = 0x3f318000;
          auVar150 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar264._8_4_ = 0x3ab743ce;
          auVar264._0_8_ = 0x3ab743ce3ab743ce;
          auVar264._12_4_ = 0x3ab743ce;
          auVar264._16_4_ = 0x3ab743ce;
          auVar264._20_4_ = 0x3ab743ce;
          auVar264._24_4_ = 0x3ab743ce;
          auVar264._28_4_ = 0x3ab743ce;
          auVar276._8_4_ = 0x3c088908;
          auVar276._0_8_ = 0x3c0889083c088908;
          auVar276._12_4_ = 0x3c088908;
          auVar276._16_4_ = 0x3c088908;
          auVar276._20_4_ = 0x3c088908;
          auVar276._24_4_ = 0x3c088908;
          auVar276._28_4_ = 0x3c088908;
          auVar282._8_4_ = 0x3d2aa9c1;
          auVar282._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar282._12_4_ = 0x3d2aa9c1;
          auVar282._16_4_ = 0x3d2aa9c1;
          auVar282._20_4_ = 0x3d2aa9c1;
          auVar282._24_4_ = 0x3d2aa9c1;
          auVar282._28_4_ = 0x3d2aa9c1;
          auVar288._8_4_ = 0x3e2aaaaa;
          auVar288._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar288._12_4_ = 0x3e2aaaaa;
          auVar288._16_4_ = 0x3e2aaaaa;
          auVar288._20_4_ = 0x3e2aaaaa;
          auVar288._24_4_ = 0x3e2aaaaa;
          auVar288._28_4_ = 0x3e2aaaaa;
          auVar294._8_4_ = 0x3f800000;
          auVar294._0_8_ = 0x3f8000003f800000;
          auVar294._12_4_ = 0x3f800000;
          auVar294._16_4_ = 0x3f800000;
          auVar294._20_4_ = 0x3f800000;
          auVar294._24_4_ = 0x3f800000;
          auVar294._28_4_ = 0x3f800000;
          auVar300._8_4_ = 0xb95e8083;
          auVar300._0_8_ = 0xb95e8083b95e8083;
          auVar300._12_4_ = 0xb95e8083;
          auVar300._16_4_ = 0xb95e8083;
          auVar300._20_4_ = 0xb95e8083;
          auVar300._24_4_ = 0xb95e8083;
          auVar300._28_4_ = 0xb95e8083;
          auVar151 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar152 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar153 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar154 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar155 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar106 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
          in_ZMM30 = ZEXT1664(auVar106);
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          for (pvVar90 = (void *)0x0; pvVar90 != pvVar86; pvVar90 = (void *)((long)pvVar90 + 1)) {
            pauVar92 = (undefined1 (*) [32])
                       ((long)top_blob->w * (long)pvVar90 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            for (iVar94 = 0; iVar94 <= iVar101; iVar94 = iVar94 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar198 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var5) +
                                     (long)pvVar90 * 0x20));
              }
              pauVar102 = (undefined1 (*) [32])
                          ((this->weight_data_packed).cstep * (long)pvVar90 *
                           (this->weight_data_packed).elemsize +
                          (long)(this->weight_data_packed).data);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                puVar95 = (undefined4 *)
                          ((long)local_d8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar94 * 8) * 4 +
                          (long)local_d8.w *
                          CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97);
                iVar91 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                  iVar91 = 0;
                }
                while (bVar105 = iVar91 != 0, iVar91 = iVar91 + -1, bVar105) {
                  uVar1 = *puVar95;
                  auVar160._4_4_ = uVar1;
                  auVar160._0_4_ = uVar1;
                  auVar160._8_4_ = uVar1;
                  auVar160._12_4_ = uVar1;
                  auVar160._16_4_ = uVar1;
                  auVar160._20_4_ = uVar1;
                  auVar160._24_4_ = uVar1;
                  auVar160._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar198._0_32_,*pauVar102,auVar160);
                  uVar1 = puVar95[1];
                  auVar164._4_4_ = uVar1;
                  auVar164._0_4_ = uVar1;
                  auVar164._8_4_ = uVar1;
                  auVar164._12_4_ = uVar1;
                  auVar164._16_4_ = uVar1;
                  auVar164._20_4_ = uVar1;
                  auVar164._24_4_ = uVar1;
                  auVar164._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar160,pauVar102[1],auVar164);
                  uVar1 = puVar95[2];
                  auVar162._4_4_ = uVar1;
                  auVar162._0_4_ = uVar1;
                  auVar162._8_4_ = uVar1;
                  auVar162._12_4_ = uVar1;
                  auVar162._16_4_ = uVar1;
                  auVar162._20_4_ = uVar1;
                  auVar162._24_4_ = uVar1;
                  auVar162._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar160,pauVar102[2],auVar162);
                  uVar1 = puVar95[3];
                  auVar261._4_4_ = uVar1;
                  auVar261._0_4_ = uVar1;
                  auVar261._8_4_ = uVar1;
                  auVar261._12_4_ = uVar1;
                  auVar261._16_4_ = uVar1;
                  auVar261._20_4_ = uVar1;
                  auVar261._24_4_ = uVar1;
                  auVar261._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar160,pauVar102[3],auVar261);
                  uVar1 = puVar95[4];
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  auVar45._16_4_ = uVar1;
                  auVar45._20_4_ = uVar1;
                  auVar45._24_4_ = uVar1;
                  auVar45._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar160,pauVar102[4],auVar45);
                  uVar1 = puVar95[5];
                  auVar46._4_4_ = uVar1;
                  auVar46._0_4_ = uVar1;
                  auVar46._8_4_ = uVar1;
                  auVar46._12_4_ = uVar1;
                  auVar46._16_4_ = uVar1;
                  auVar46._20_4_ = uVar1;
                  auVar46._24_4_ = uVar1;
                  auVar46._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar160,pauVar102[5],auVar46);
                  uVar1 = puVar95[6];
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  auVar47._16_4_ = uVar1;
                  auVar47._20_4_ = uVar1;
                  auVar47._24_4_ = uVar1;
                  auVar47._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar160,pauVar102[6],auVar47);
                  uVar1 = puVar95[7];
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar48._16_4_ = uVar1;
                  auVar48._20_4_ = uVar1;
                  auVar48._24_4_ = uVar1;
                  auVar48._28_4_ = uVar1;
                  auVar160 = vfmadd231ps_avx512vl(auVar160,pauVar102[7],auVar48);
                  auVar198 = ZEXT3264(auVar160);
                  puVar95 = puVar95 + (long)*(int *)(&this->field_0xd8 + (long)p_Var7) * 8;
                  pauVar102 = pauVar102 + 8;
                }
              }
              auVar160 = auVar198._0_32_;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                auVar161 = vmaxps_avx512vl(auVar160,ZEXT1632(auVar106));
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 2:
                  auVar160 = vminps_avx512vl(auVar160,ZEXT1632(auVar106));
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar60._4_4_ = uVar1;
                  auVar60._0_4_ = uVar1;
                  auVar60._8_4_ = uVar1;
                  auVar60._12_4_ = uVar1;
                  auVar60._16_4_ = uVar1;
                  auVar60._20_4_ = uVar1;
                  auVar60._24_4_ = uVar1;
                  auVar60._28_4_ = uVar1;
                  auVar161 = vfmadd231ps_avx512vl(auVar161,auVar160,auVar60);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar58._4_4_ = uVar1;
                  auVar58._0_4_ = uVar1;
                  auVar58._8_4_ = uVar1;
                  auVar58._12_4_ = uVar1;
                  auVar58._16_4_ = uVar1;
                  auVar58._20_4_ = uVar1;
                  auVar58._24_4_ = uVar1;
                  auVar58._28_4_ = uVar1;
                  auVar160 = vmaxps_avx512vl(auVar160,auVar58);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar59._4_4_ = uVar1;
                  auVar59._0_4_ = uVar1;
                  auVar59._8_4_ = uVar1;
                  auVar59._12_4_ = uVar1;
                  auVar59._16_4_ = uVar1;
                  auVar59._20_4_ = uVar1;
                  auVar59._24_4_ = uVar1;
                  auVar59._28_4_ = uVar1;
                  auVar161 = vminps_avx512vl(auVar160,auVar59);
                  break;
                case 4:
                  auVar56._8_4_ = 0x80000000;
                  auVar56._0_8_ = 0x8000000080000000;
                  auVar56._12_4_ = 0x80000000;
                  auVar56._16_4_ = 0x80000000;
                  auVar56._20_4_ = 0x80000000;
                  auVar56._24_4_ = 0x80000000;
                  auVar56._28_4_ = 0x80000000;
                  auVar160 = vxorps_avx512vl(auVar160,auVar56);
                  auVar160 = vminps_avx(auVar160,auVar170);
                  auVar160 = vmaxps_avx(auVar160,auVar171);
                  auVar107 = vfmadd231ps_fma(auVar172,auVar160,auVar182);
                  auVar164 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar164,1);
                  auVar162 = vsubps_avx512vl(auVar164,auVar176);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar169._0_4_ =
                       (float)((uint)bVar105 * auVar162._0_4_ | (uint)!bVar105 * auVar164._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar169._4_4_ =
                       (float)((uint)bVar105 * auVar162._4_4_ | (uint)!bVar105 * auVar164._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar169._8_4_ =
                       (float)((uint)bVar105 * auVar162._8_4_ | (uint)!bVar105 * auVar164._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar169._12_4_ =
                       (float)((uint)bVar105 * auVar162._12_4_ | (uint)!bVar105 * auVar164._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar169._16_4_ =
                       (float)((uint)bVar105 * auVar162._16_4_ | (uint)!bVar105 * auVar164._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar169._20_4_ =
                       (float)((uint)bVar105 * auVar162._20_4_ | (uint)!bVar105 * auVar164._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar169._24_4_ =
                       (float)((uint)bVar105 * auVar162._24_4_ | (uint)!bVar105 * auVar164._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar169._28_4_ =
                       (float)((uint)bVar105 * auVar162._28_4_ | (uint)!bVar105 * auVar164._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar160,auVar169,auVar174);
                  auVar57._8_4_ = 0x395e8083;
                  auVar57._0_8_ = 0x395e8083395e8083;
                  auVar57._12_4_ = 0x395e8083;
                  auVar57._16_4_ = 0x395e8083;
                  auVar57._20_4_ = 0x395e8083;
                  auVar57._24_4_ = 0x395e8083;
                  auVar57._28_4_ = 0x395e8083;
                  auVar160 = vfmsub231ps_avx512vl(ZEXT1632(auVar107),auVar169,auVar57);
                  auVar239._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                  auVar239._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                  auVar239._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                  auVar239._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                  auVar239._16_4_ = auVar160._16_4_ * auVar160._16_4_;
                  auVar239._20_4_ = auVar160._20_4_ * auVar160._20_4_;
                  auVar239._24_4_ = auVar160._24_4_ * auVar160._24_4_;
                  auVar239._28_4_ = 0;
                  auVar107 = vfmadd213ps_fma(auVar150,auVar160,auVar264);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar160,auVar276);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar160,auVar282);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar160,auVar288);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar160,auVar172);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar239,auVar160);
                  auVar195._0_4_ = auVar107._0_4_ + 1.0;
                  auVar195._4_4_ = auVar107._4_4_ + 1.0;
                  auVar195._8_4_ = auVar107._8_4_ + 1.0;
                  auVar195._12_4_ = auVar107._12_4_ + 1.0;
                  auVar195._16_4_ = 0x3f800000;
                  auVar195._20_4_ = 0x3f800000;
                  auVar195._24_4_ = 0x3f800000;
                  auVar195._28_4_ = 0x3f800000;
                  auVar240._0_4_ = (int)auVar169._0_4_;
                  auVar240._4_4_ = (int)auVar169._4_4_;
                  auVar240._8_4_ = (int)auVar169._8_4_;
                  auVar240._12_4_ = (int)auVar169._12_4_;
                  auVar240._16_4_ = (int)auVar169._16_4_;
                  auVar240._20_4_ = (int)auVar169._20_4_;
                  auVar240._24_4_ = (int)auVar169._24_4_;
                  auVar240._28_4_ = (int)auVar169._28_4_;
                  auVar160 = vpslld_avx2(auVar240,0x17);
                  auVar160 = vpaddd_avx2(auVar294,auVar160);
                  auVar107 = vfmadd213ps_fma(auVar160,auVar195,auVar176);
                  auVar160 = vrcpps_avx(ZEXT1632(auVar107));
                  auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar160,auVar176);
                  auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar160,auVar160);
                  auVar161 = ZEXT1632(auVar107);
                  break;
                case 5:
                  auVar160 = vminps_avx(auVar160,auVar170);
                  auVar160 = vmaxps_avx(auVar160,auVar171);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar160,auVar172);
                  auVar164 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar164,1);
                  auVar162 = vsubps_avx512vl(auVar164,auVar176);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar163._0_4_ =
                       (float)((uint)bVar105 * auVar162._0_4_ | (uint)!bVar105 * auVar164._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar163._4_4_ =
                       (float)((uint)bVar105 * auVar162._4_4_ | (uint)!bVar105 * auVar164._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar163._8_4_ =
                       (float)((uint)bVar105 * auVar162._8_4_ | (uint)!bVar105 * auVar164._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar163._12_4_ =
                       (float)((uint)bVar105 * auVar162._12_4_ | (uint)!bVar105 * auVar164._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar163._16_4_ =
                       (float)((uint)bVar105 * auVar162._16_4_ | (uint)!bVar105 * auVar164._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar163._20_4_ =
                       (float)((uint)bVar105 * auVar162._20_4_ | (uint)!bVar105 * auVar164._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar163._24_4_ =
                       (float)((uint)bVar105 * auVar162._24_4_ | (uint)!bVar105 * auVar164._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar163._28_4_ =
                       (float)((uint)bVar105 * auVar162._28_4_ | (uint)!bVar105 * auVar164._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar160,auVar163,auVar174);
                  auVar107 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar163,auVar300);
                  auVar164 = ZEXT1632(auVar107);
                  auVar160 = vfmadd213ps_avx512vl(auVar150,auVar164,auVar264);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar276);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar282);
                  auVar164 = ZEXT1632(auVar107);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar288);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar172);
                  auVar160 = vfmadd213ps_avx512vl
                                       (auVar160,ZEXT1632(CONCAT412(auVar107._12_4_ *
                                                                    auVar107._12_4_,
                                                                    CONCAT48(auVar107._8_4_ *
                                                                             auVar107._8_4_,
                                                                             CONCAT44(auVar107._4_4_
                                                                                      * auVar107.
                                                  _4_4_,auVar107._0_4_ * auVar107._0_4_)))),auVar164
                                       );
                  auVar164 = vaddps_avx512vl(auVar160,auVar176);
                  auVar260._0_4_ = (int)auVar163._0_4_;
                  auVar260._4_4_ = (int)auVar163._4_4_;
                  auVar260._8_4_ = (int)auVar163._8_4_;
                  auVar260._12_4_ = (int)auVar163._12_4_;
                  auVar260._16_4_ = (int)auVar163._16_4_;
                  auVar260._20_4_ = (int)auVar163._20_4_;
                  auVar260._24_4_ = (int)auVar163._24_4_;
                  auVar260._28_4_ = (int)auVar163._28_4_;
                  auVar160 = vpslld_avx2(auVar260,0x17);
                  auVar160 = vpaddd_avx2(auVar160,auVar294);
                  auVar107 = vfmadd213ps_fma(auVar160,auVar164,auVar176);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),ZEXT1632(auVar106),2);
                  auVar50._8_4_ = 0x800000;
                  auVar50._0_8_ = 0x80000000800000;
                  auVar50._12_4_ = 0x800000;
                  auVar50._16_4_ = 0x800000;
                  auVar50._20_4_ = 0x800000;
                  auVar50._24_4_ = 0x800000;
                  auVar50._28_4_ = 0x800000;
                  auVar160 = vmaxps_avx512vl(ZEXT1632(auVar107),auVar50);
                  auVar261 = vpsrld_avx2(auVar160,0x17);
                  auVar319._8_4_ = 0x807fffff;
                  auVar319._0_8_ = 0x807fffff807fffff;
                  auVar319._12_4_ = 0x807fffff;
                  auVar319._16_4_ = 0x807fffff;
                  auVar319._20_4_ = 0x807fffff;
                  auVar319._24_4_ = 0x807fffff;
                  auVar319._28_4_ = 0x807fffff;
                  auVar51._8_4_ = 0x3f000000;
                  auVar51._0_8_ = 0x3f0000003f000000;
                  auVar51._12_4_ = 0x3f000000;
                  auVar51._16_4_ = 0x3f000000;
                  auVar51._20_4_ = 0x3f000000;
                  auVar51._24_4_ = 0x3f000000;
                  auVar51._28_4_ = 0x3f000000;
                  auVar160 = vpternlogd_avx512vl(auVar160,auVar319,auVar51,0xea);
                  auVar52._8_4_ = 0x3f3504f3;
                  auVar52._0_8_ = 0x3f3504f33f3504f3;
                  auVar52._12_4_ = 0x3f3504f3;
                  auVar52._16_4_ = 0x3f3504f3;
                  auVar52._20_4_ = 0x3f3504f3;
                  auVar52._24_4_ = 0x3f3504f3;
                  auVar52._28_4_ = 0x3f3504f3;
                  uVar12 = vcmpps_avx512vl(auVar160,auVar52,1);
                  auVar164 = vaddps_avx512vl(auVar160,auVar151);
                  auVar162 = vaddps_avx512vl(auVar164,auVar160);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar165._0_4_ =
                       (float)((uint)bVar105 * auVar162._0_4_ | (uint)!bVar105 * auVar164._0_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar165._4_4_ =
                       (float)((uint)bVar105 * auVar162._4_4_ | (uint)!bVar105 * auVar164._4_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar165._8_4_ =
                       (float)((uint)bVar105 * auVar162._8_4_ | (uint)!bVar105 * auVar164._8_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar165._12_4_ =
                       (float)((uint)bVar105 * auVar162._12_4_ | (uint)!bVar105 * auVar164._12_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 4) & 1);
                  auVar165._16_4_ =
                       (float)((uint)bVar105 * auVar162._16_4_ | (uint)!bVar105 * auVar164._16_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 5) & 1);
                  auVar165._20_4_ =
                       (float)((uint)bVar105 * auVar162._20_4_ | (uint)!bVar105 * auVar164._20_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 6) & 1);
                  auVar165._24_4_ =
                       (float)((uint)bVar105 * auVar162._24_4_ | (uint)!bVar105 * auVar164._24_4_);
                  bVar105 = SUB81(uVar12 >> 7,0);
                  auVar165._28_4_ =
                       (uint)bVar105 * auVar162._28_4_ | (uint)!bVar105 * auVar164._28_4_;
                  auVar79._4_4_ = auVar165._4_4_ * auVar165._4_4_;
                  auVar79._0_4_ = auVar165._0_4_ * auVar165._0_4_;
                  auVar79._8_4_ = auVar165._8_4_ * auVar165._8_4_;
                  auVar79._12_4_ = auVar165._12_4_ * auVar165._12_4_;
                  auVar79._16_4_ = auVar165._16_4_ * auVar165._16_4_;
                  auVar79._20_4_ = auVar165._20_4_ * auVar165._20_4_;
                  auVar79._24_4_ = auVar165._24_4_ * auVar165._24_4_;
                  auVar79._28_4_ = auVar160._28_4_;
                  auVar53._8_4_ = 0xbdebd1b8;
                  auVar53._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar53._12_4_ = 0xbdebd1b8;
                  auVar53._16_4_ = 0xbdebd1b8;
                  auVar53._20_4_ = 0xbdebd1b8;
                  auVar53._24_4_ = 0xbdebd1b8;
                  auVar53._28_4_ = 0xbdebd1b8;
                  auVar160 = vfmadd213ps_avx512vl(auVar152,auVar165,auVar53);
                  auVar54._8_4_ = 0x3def251a;
                  auVar54._0_8_ = 0x3def251a3def251a;
                  auVar54._12_4_ = 0x3def251a;
                  auVar54._16_4_ = 0x3def251a;
                  auVar54._20_4_ = 0x3def251a;
                  auVar54._24_4_ = 0x3def251a;
                  auVar54._28_4_ = 0x3def251a;
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar165,auVar54);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar165,auVar153);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar165,auVar154);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar165,auVar155);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar165,auVar156);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar165,auVar157);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar165,auVar158);
                  auVar164 = vmulps_avx512vl(auVar79,auVar165);
                  auVar164 = vmulps_avx512vl(auVar164,auVar160);
                  auVar55._8_4_ = 0xffffff82;
                  auVar55._0_8_ = 0xffffff82ffffff82;
                  auVar55._12_4_ = 0xffffff82;
                  auVar55._16_4_ = 0xffffff82;
                  auVar55._20_4_ = 0xffffff82;
                  auVar55._24_4_ = 0xffffff82;
                  auVar55._28_4_ = 0xffffff82;
                  auVar160 = vpaddd_avx512vl(auVar261,auVar55);
                  auVar160 = vcvtdq2ps_avx(auVar160);
                  auVar162 = vsubps_avx512vl(auVar160,auVar176);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar166._0_4_ = (uint)bVar105 * auVar162._0_4_ | (uint)!bVar105 * auVar160._0_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar166._4_4_ = (uint)bVar105 * auVar162._4_4_ | (uint)!bVar105 * auVar160._4_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar166._8_4_ = (uint)bVar105 * auVar162._8_4_ | (uint)!bVar105 * auVar160._8_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar166._12_4_ =
                       (uint)bVar105 * auVar162._12_4_ | (uint)!bVar105 * auVar160._12_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 4) & 1);
                  auVar166._16_4_ =
                       (uint)bVar105 * auVar162._16_4_ | (uint)!bVar105 * auVar160._16_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 5) & 1);
                  auVar166._20_4_ =
                       (uint)bVar105 * auVar162._20_4_ | (uint)!bVar105 * auVar160._20_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 6) & 1);
                  auVar166._24_4_ =
                       (uint)bVar105 * auVar162._24_4_ | (uint)!bVar105 * auVar160._24_4_;
                  bVar105 = SUB81(uVar12 >> 7,0);
                  auVar166._28_4_ =
                       (uint)bVar105 * auVar162._28_4_ | (uint)!bVar105 * auVar160._28_4_;
                  auVar160 = vfmadd231ps_avx512vl(auVar164,auVar166,auVar300);
                  auVar160 = vfmsub231ps_avx512vl(auVar160,auVar172,auVar79);
                  auVar160 = vsubps_avx512vl(auVar160,auVar165);
                  auVar107 = vfmsub231ps_fma(auVar160,auVar174,auVar166);
                  auVar160 = vmulps_avx512vl(ZEXT1632(auVar107),auVar159);
                  auVar164 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar167._0_4_ = (uint)bVar105 * auVar164._0_4_ | (uint)!bVar105 * auVar160._0_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar167._4_4_ = (uint)bVar105 * auVar164._4_4_ | (uint)!bVar105 * auVar160._4_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar167._8_4_ = (uint)bVar105 * auVar164._8_4_ | (uint)!bVar105 * auVar160._8_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar167._12_4_ =
                       (uint)bVar105 * auVar164._12_4_ | (uint)!bVar105 * auVar160._12_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar167._16_4_ =
                       (uint)bVar105 * auVar164._16_4_ | (uint)!bVar105 * auVar160._16_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar167._20_4_ =
                       (uint)bVar105 * auVar164._20_4_ | (uint)!bVar105 * auVar160._20_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar167._24_4_ =
                       (uint)bVar105 * auVar164._24_4_ | (uint)!bVar105 * auVar160._24_4_;
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar167._28_4_ =
                       (uint)bVar105 * auVar164._28_4_ | (uint)!bVar105 * auVar160._28_4_;
                  auVar160 = vminps_avx(auVar167,auVar170);
                  auVar160 = vmaxps_avx(auVar160,auVar171);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar160,auVar172);
                  auVar164 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar164,1);
                  auVar162 = vsubps_avx512vl(auVar164,auVar176);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar168._0_4_ =
                       (float)((uint)bVar105 * auVar162._0_4_ | (uint)!bVar105 * auVar164._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar168._4_4_ =
                       (float)((uint)bVar105 * auVar162._4_4_ | (uint)!bVar105 * auVar164._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar168._8_4_ =
                       (float)((uint)bVar105 * auVar162._8_4_ | (uint)!bVar105 * auVar164._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar168._12_4_ =
                       (float)((uint)bVar105 * auVar162._12_4_ | (uint)!bVar105 * auVar164._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar168._16_4_ =
                       (float)((uint)bVar105 * auVar162._16_4_ | (uint)!bVar105 * auVar164._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar168._20_4_ =
                       (float)((uint)bVar105 * auVar162._20_4_ | (uint)!bVar105 * auVar164._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar168._24_4_ =
                       (float)((uint)bVar105 * auVar162._24_4_ | (uint)!bVar105 * auVar164._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar168._28_4_ =
                       (float)((uint)bVar105 * auVar162._28_4_ | (uint)!bVar105 * auVar164._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar160,auVar168,auVar174);
                  auVar107 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar168,auVar300);
                  auVar164 = ZEXT1632(auVar107);
                  auVar160 = vfmadd213ps_avx512vl(auVar150,auVar164,auVar264);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar276);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar282);
                  auVar164 = ZEXT1632(auVar107);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar288);
                  auVar160 = vfmadd213ps_avx512vl(auVar160,auVar164,auVar172);
                  auVar160 = vfmadd213ps_avx512vl
                                       (auVar160,ZEXT1632(CONCAT412(auVar107._12_4_ *
                                                                    auVar107._12_4_,
                                                                    CONCAT48(auVar107._8_4_ *
                                                                             auVar107._8_4_,
                                                                             CONCAT44(auVar107._4_4_
                                                                                      * auVar107.
                                                  _4_4_,auVar107._0_4_ * auVar107._0_4_)))),auVar164
                                       );
                  auVar164 = vaddps_avx512vl(auVar160,auVar176);
                  auVar262._0_4_ = (int)auVar168._0_4_;
                  auVar262._4_4_ = (int)auVar168._4_4_;
                  auVar262._8_4_ = (int)auVar168._8_4_;
                  auVar262._12_4_ = (int)auVar168._12_4_;
                  auVar262._16_4_ = (int)auVar168._16_4_;
                  auVar262._20_4_ = (int)auVar168._20_4_;
                  auVar262._24_4_ = (int)auVar168._24_4_;
                  auVar262._28_4_ = (int)auVar168._28_4_;
                  auVar160 = vpslld_avx2(auVar262,0x17);
                  auVar160 = vpaddd_avx2(auVar160,auVar294);
                  auVar107 = vfmadd213ps_fma(auVar160,auVar164,auVar176);
                  auVar160 = vrcpps_avx(ZEXT1632(auVar107));
                  auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar160,auVar176);
                  auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar160,auVar160);
                  auVar164 = vfnmadd213ps_avx512vl(ZEXT1632(auVar107),auVar159,auVar151);
                  auVar161._4_4_ = auVar164._4_4_ * auVar198._4_4_;
                  auVar161._0_4_ = auVar164._0_4_ * auVar198._0_4_;
                  auVar161._8_4_ = auVar164._8_4_ * auVar198._8_4_;
                  auVar161._12_4_ = auVar164._12_4_ * auVar198._12_4_;
                  auVar161._16_4_ = auVar164._16_4_ * auVar198._16_4_;
                  auVar161._20_4_ = auVar164._20_4_ * auVar198._20_4_;
                  auVar161._24_4_ = auVar164._24_4_ * auVar198._24_4_;
                  auVar161._28_4_ = auVar160._28_4_;
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar241._4_4_ = uVar1;
                  auVar241._0_4_ = uVar1;
                  auVar241._8_4_ = uVar1;
                  auVar241._12_4_ = uVar1;
                  auVar241._16_4_ = uVar1;
                  auVar241._20_4_ = uVar1;
                  auVar241._24_4_ = uVar1;
                  auVar241._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar49._16_4_ = uVar1;
                  auVar49._20_4_ = uVar1;
                  auVar49._24_4_ = uVar1;
                  auVar49._28_4_ = uVar1;
                  auVar160 = vfmadd213ps_avx512vl(auVar241,auVar160,auVar49);
                  auVar160 = vmaxps_avx512vl(auVar160,ZEXT1632(auVar106));
                  auVar160 = vminps_avx(auVar160,auVar176);
                  auVar161._4_4_ = auVar160._4_4_ * auVar198._4_4_;
                  auVar161._0_4_ = auVar160._0_4_ * auVar198._0_4_;
                  auVar161._8_4_ = auVar160._8_4_ * auVar198._8_4_;
                  auVar161._12_4_ = auVar160._12_4_ * auVar198._12_4_;
                  auVar161._16_4_ = auVar160._16_4_ * auVar198._16_4_;
                  auVar161._20_4_ = auVar160._20_4_ * auVar198._20_4_;
                  auVar161._24_4_ = auVar160._24_4_ * auVar198._24_4_;
                  auVar161._28_4_ = auVar160._28_4_;
                }
                auVar160 = auVar161;
              }
              *pauVar92 = auVar160;
              pauVar92 = pauVar92 + 1;
            }
          }
        }
        if ((iVar3 == 1) && (_elempack == 8)) {
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = (void *)0x0;
          if (0 < iVar99) {
            pvVar86 = pvVar84;
          }
          auVar201._8_4_ = 0x42b0c0a5;
          auVar201._0_8_ = 0x42b0c0a542b0c0a5;
          auVar201._12_4_ = 0x42b0c0a5;
          auVar201._16_4_ = 0x42b0c0a5;
          auVar201._20_4_ = 0x42b0c0a5;
          auVar201._24_4_ = 0x42b0c0a5;
          auVar201._28_4_ = 0x42b0c0a5;
          auVar205._8_4_ = 0xc2b0c0a5;
          auVar205._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar205._12_4_ = 0xc2b0c0a5;
          auVar205._16_4_ = 0xc2b0c0a5;
          auVar205._20_4_ = 0xc2b0c0a5;
          auVar205._24_4_ = 0xc2b0c0a5;
          auVar205._28_4_ = 0xc2b0c0a5;
          auVar210._8_4_ = 0x3f000000;
          auVar210._0_8_ = 0x3f0000003f000000;
          auVar210._12_4_ = 0x3f000000;
          auVar210._16_4_ = 0x3f000000;
          auVar210._20_4_ = 0x3f000000;
          auVar210._24_4_ = 0x3f000000;
          auVar210._28_4_ = 0x3f000000;
          auVar214._8_4_ = 0x3fb8aa3b;
          auVar214._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar214._12_4_ = 0x3fb8aa3b;
          auVar214._16_4_ = 0x3fb8aa3b;
          auVar214._20_4_ = 0x3fb8aa3b;
          auVar214._24_4_ = 0x3fb8aa3b;
          auVar214._28_4_ = 0x3fb8aa3b;
          auVar218._8_4_ = 0x3f800000;
          auVar218._0_8_ = 0x3f8000003f800000;
          auVar218._12_4_ = 0x3f800000;
          auVar218._16_4_ = 0x3f800000;
          auVar218._20_4_ = 0x3f800000;
          auVar218._24_4_ = 0x3f800000;
          auVar218._28_4_ = 0x3f800000;
          auVar222._8_4_ = 0x3f318000;
          auVar222._0_8_ = 0x3f3180003f318000;
          auVar222._12_4_ = 0x3f318000;
          auVar222._16_4_ = 0x3f318000;
          auVar222._20_4_ = 0x3f318000;
          auVar222._24_4_ = 0x3f318000;
          auVar222._28_4_ = 0x3f318000;
          auVar150 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar271._8_4_ = 0x3ab743ce;
          auVar271._0_8_ = 0x3ab743ce3ab743ce;
          auVar271._12_4_ = 0x3ab743ce;
          auVar271._16_4_ = 0x3ab743ce;
          auVar271._20_4_ = 0x3ab743ce;
          auVar271._24_4_ = 0x3ab743ce;
          auVar271._28_4_ = 0x3ab743ce;
          auVar277._8_4_ = 0x3c088908;
          auVar277._0_8_ = 0x3c0889083c088908;
          auVar277._12_4_ = 0x3c088908;
          auVar277._16_4_ = 0x3c088908;
          auVar277._20_4_ = 0x3c088908;
          auVar277._24_4_ = 0x3c088908;
          auVar277._28_4_ = 0x3c088908;
          auVar283._8_4_ = 0x3d2aa9c1;
          auVar283._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar283._12_4_ = 0x3d2aa9c1;
          auVar283._16_4_ = 0x3d2aa9c1;
          auVar283._20_4_ = 0x3d2aa9c1;
          auVar283._24_4_ = 0x3d2aa9c1;
          auVar283._28_4_ = 0x3d2aa9c1;
          auVar289._8_4_ = 0x3e2aaaaa;
          auVar289._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar289._12_4_ = 0x3e2aaaaa;
          auVar289._16_4_ = 0x3e2aaaaa;
          auVar289._20_4_ = 0x3e2aaaaa;
          auVar289._24_4_ = 0x3e2aaaaa;
          auVar289._28_4_ = 0x3e2aaaaa;
          auVar295._8_4_ = 0x3f800000;
          auVar295._0_8_ = 0x3f8000003f800000;
          auVar295._12_4_ = 0x3f800000;
          auVar295._16_4_ = 0x3f800000;
          auVar295._20_4_ = 0x3f800000;
          auVar295._24_4_ = 0x3f800000;
          auVar295._28_4_ = 0x3f800000;
          auVar301._8_4_ = 0xb95e8083;
          auVar301._0_8_ = 0xb95e8083b95e8083;
          auVar301._12_4_ = 0xb95e8083;
          auVar301._16_4_ = 0xb95e8083;
          auVar301._20_4_ = 0xb95e8083;
          auVar301._24_4_ = 0xb95e8083;
          auVar301._28_4_ = 0xb95e8083;
          auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar152 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar153 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar154 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar155 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar170 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar171 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar106 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
          in_ZMM30 = ZEXT1664(auVar106);
          auVar172 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          for (pvVar90 = (void *)0x0; pvVar90 != pvVar86; pvVar90 = (void *)((long)pvVar90 + 1)) {
            pauVar92 = (undefined1 (*) [32])
                       ((long)top_blob->w * (long)pvVar90 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            for (iVar94 = 0; iVar94 <= iVar101; iVar94 = iVar94 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar198 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var5) +
                                     (long)pvVar90 * 0x20));
              }
              pauVar102 = (undefined1 (*) [32])
                          ((this->weight_data_packed).cstep * (long)pvVar90 *
                           (this->weight_data_packed).elemsize +
                          (long)(this->weight_data_packed).data);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                puVar95 = (undefined4 *)
                          ((long)local_d8.data +
                          (long)*(int *)(&this->field_0xdc + (long)p_Var7) * (long)iVar94 * 4 +
                          (long)local_d8.w *
                          CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97);
                iVar91 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                  iVar91 = 0;
                }
                while (bVar105 = iVar91 != 0, iVar91 = iVar91 + -1, bVar105) {
                  uVar1 = *puVar95;
                  auVar242._4_4_ = uVar1;
                  auVar242._0_4_ = uVar1;
                  auVar242._8_4_ = uVar1;
                  auVar242._12_4_ = uVar1;
                  auVar242._16_4_ = uVar1;
                  auVar242._20_4_ = uVar1;
                  auVar242._24_4_ = uVar1;
                  auVar242._28_4_ = uVar1;
                  auVar107 = vfmadd231ps_fma(auVar198._0_32_,auVar242,*pauVar102);
                  auVar198 = ZEXT1664(auVar107);
                  puVar95 = puVar95 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                  pauVar102 = pauVar102 + 1;
                }
              }
              auVar182 = auVar198._0_32_;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                auVar173 = vmaxps_avx512vl(auVar182,ZEXT1632(auVar106));
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 2:
                  auVar182 = vminps_avx512vl(auVar182,ZEXT1632(auVar106));
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar69._4_4_ = uVar1;
                  auVar69._0_4_ = uVar1;
                  auVar69._8_4_ = uVar1;
                  auVar69._12_4_ = uVar1;
                  auVar69._16_4_ = uVar1;
                  auVar69._20_4_ = uVar1;
                  auVar69._24_4_ = uVar1;
                  auVar69._28_4_ = uVar1;
                  auVar173 = vfmadd231ps_avx512vl(auVar173,auVar182,auVar69);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar67._4_4_ = uVar1;
                  auVar67._0_4_ = uVar1;
                  auVar67._8_4_ = uVar1;
                  auVar67._12_4_ = uVar1;
                  auVar67._16_4_ = uVar1;
                  auVar67._20_4_ = uVar1;
                  auVar67._24_4_ = uVar1;
                  auVar67._28_4_ = uVar1;
                  auVar182 = vmaxps_avx512vl(auVar182,auVar67);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar68._4_4_ = uVar1;
                  auVar68._0_4_ = uVar1;
                  auVar68._8_4_ = uVar1;
                  auVar68._12_4_ = uVar1;
                  auVar68._16_4_ = uVar1;
                  auVar68._20_4_ = uVar1;
                  auVar68._24_4_ = uVar1;
                  auVar68._28_4_ = uVar1;
                  auVar173 = vminps_avx512vl(auVar182,auVar68);
                  break;
                case 4:
                  auVar65._8_4_ = 0x80000000;
                  auVar65._0_8_ = 0x8000000080000000;
                  auVar65._12_4_ = 0x80000000;
                  auVar65._16_4_ = 0x80000000;
                  auVar65._20_4_ = 0x80000000;
                  auVar65._24_4_ = 0x80000000;
                  auVar65._28_4_ = 0x80000000;
                  auVar182 = vxorps_avx512vl(auVar182,auVar65);
                  auVar182 = vminps_avx(auVar182,auVar201);
                  auVar182 = vmaxps_avx(auVar182,auVar205);
                  auVar107 = vfmadd231ps_fma(auVar210,auVar182,auVar214);
                  auVar176 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar176,1);
                  auVar174 = vsubps_avx512vl(auVar176,auVar218);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar181._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar181._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar181._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar181._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar181._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar181._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar181._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar181._28_4_ =
                       (float)((uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar181,auVar222);
                  auVar66._8_4_ = 0x395e8083;
                  auVar66._0_8_ = 0x395e8083395e8083;
                  auVar66._12_4_ = 0x395e8083;
                  auVar66._16_4_ = 0x395e8083;
                  auVar66._20_4_ = 0x395e8083;
                  auVar66._24_4_ = 0x395e8083;
                  auVar66._28_4_ = 0x395e8083;
                  auVar182 = vfmsub231ps_avx512vl(ZEXT1632(auVar107),auVar181,auVar66);
                  auVar243._0_4_ = auVar182._0_4_ * auVar182._0_4_;
                  auVar243._4_4_ = auVar182._4_4_ * auVar182._4_4_;
                  auVar243._8_4_ = auVar182._8_4_ * auVar182._8_4_;
                  auVar243._12_4_ = auVar182._12_4_ * auVar182._12_4_;
                  auVar243._16_4_ = auVar182._16_4_ * auVar182._16_4_;
                  auVar243._20_4_ = auVar182._20_4_ * auVar182._20_4_;
                  auVar243._24_4_ = auVar182._24_4_ * auVar182._24_4_;
                  auVar243._28_4_ = 0;
                  auVar107 = vfmadd213ps_fma(auVar150,auVar182,auVar271);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar277);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar283);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar289);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar210);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar243,auVar182);
                  auVar196._0_4_ = auVar107._0_4_ + 1.0;
                  auVar196._4_4_ = auVar107._4_4_ + 1.0;
                  auVar196._8_4_ = auVar107._8_4_ + 1.0;
                  auVar196._12_4_ = auVar107._12_4_ + 1.0;
                  auVar196._16_4_ = 0x3f800000;
                  auVar196._20_4_ = 0x3f800000;
                  auVar196._24_4_ = 0x3f800000;
                  auVar196._28_4_ = 0x3f800000;
                  auVar244._0_4_ = (int)auVar181._0_4_;
                  auVar244._4_4_ = (int)auVar181._4_4_;
                  auVar244._8_4_ = (int)auVar181._8_4_;
                  auVar244._12_4_ = (int)auVar181._12_4_;
                  auVar244._16_4_ = (int)auVar181._16_4_;
                  auVar244._20_4_ = (int)auVar181._20_4_;
                  auVar244._24_4_ = (int)auVar181._24_4_;
                  auVar244._28_4_ = (int)auVar181._28_4_;
                  auVar182 = vpslld_avx2(auVar244,0x17);
                  auVar182 = vpaddd_avx2(auVar295,auVar182);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar196,auVar218);
                  auVar182 = vrcpps_avx(ZEXT1632(auVar107));
                  auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar182,auVar218);
                  auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar182,auVar182);
                  auVar173 = ZEXT1632(auVar107);
                  break;
                case 5:
                  auVar182 = vminps_avx(auVar182,auVar201);
                  auVar182 = vmaxps_avx(auVar182,auVar205);
                  auVar107 = vfmadd213ps_fma(auVar214,auVar182,auVar210);
                  auVar176 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar176,1);
                  auVar174 = vsubps_avx512vl(auVar176,auVar218);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar175._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar175._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar175._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar175._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar175._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar175._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar175._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar175._28_4_ =
                       (float)((uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar175,auVar222);
                  auVar107 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar175,auVar301);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar150,auVar176,auVar271);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar277);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar283);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar289);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar210);
                  auVar182 = vfmadd213ps_avx512vl
                                       (auVar182,ZEXT1632(CONCAT412(auVar107._12_4_ *
                                                                    auVar107._12_4_,
                                                                    CONCAT48(auVar107._8_4_ *
                                                                             auVar107._8_4_,
                                                                             CONCAT44(auVar107._4_4_
                                                                                      * auVar107.
                                                  _4_4_,auVar107._0_4_ * auVar107._0_4_)))),auVar176
                                       );
                  auVar176 = vaddps_avx512vl(auVar182,auVar218);
                  auVar263._0_4_ = (int)auVar175._0_4_;
                  auVar263._4_4_ = (int)auVar175._4_4_;
                  auVar263._8_4_ = (int)auVar175._8_4_;
                  auVar263._12_4_ = (int)auVar175._12_4_;
                  auVar263._16_4_ = (int)auVar175._16_4_;
                  auVar263._20_4_ = (int)auVar175._20_4_;
                  auVar263._24_4_ = (int)auVar175._24_4_;
                  auVar263._28_4_ = (int)auVar175._28_4_;
                  auVar182 = vpslld_avx2(auVar263,0x17);
                  auVar182 = vpaddd_avx2(auVar182,auVar295);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar176,auVar218);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),ZEXT1632(auVar106),2);
                  auVar62._8_4_ = 0x800000;
                  auVar62._0_8_ = 0x80000000800000;
                  auVar62._12_4_ = 0x800000;
                  auVar62._16_4_ = 0x800000;
                  auVar62._20_4_ = 0x800000;
                  auVar62._24_4_ = 0x800000;
                  auVar62._28_4_ = 0x800000;
                  auVar182 = vmaxps_avx512vl(ZEXT1632(auVar107),auVar62);
                  auVar264 = vpsrld_avx2(auVar182,0x17);
                  auVar320._8_4_ = 0x807fffff;
                  auVar320._0_8_ = 0x807fffff807fffff;
                  auVar320._12_4_ = 0x807fffff;
                  auVar320._16_4_ = 0x807fffff;
                  auVar320._20_4_ = 0x807fffff;
                  auVar320._24_4_ = 0x807fffff;
                  auVar320._28_4_ = 0x807fffff;
                  auVar63._8_4_ = 0x3f000000;
                  auVar63._0_8_ = 0x3f0000003f000000;
                  auVar63._12_4_ = 0x3f000000;
                  auVar63._16_4_ = 0x3f000000;
                  auVar63._20_4_ = 0x3f000000;
                  auVar63._24_4_ = 0x3f000000;
                  auVar63._28_4_ = 0x3f000000;
                  auVar182 = vpternlogd_avx512vl(auVar182,auVar320,auVar63,0xea);
                  uVar12 = vcmpps_avx512vl(auVar182,auVar151,1);
                  auVar176 = vaddps_avx512vl(auVar182,auVar152);
                  auVar174 = vaddps_avx512vl(auVar176,auVar182);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar177._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar177._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar177._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar177._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 4) & 1);
                  auVar177._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 5) & 1);
                  auVar177._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 6) & 1);
                  auVar177._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar12 >> 7,0);
                  auVar177._28_4_ =
                       (uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_;
                  auVar80._4_4_ = auVar177._4_4_ * auVar177._4_4_;
                  auVar80._0_4_ = auVar177._0_4_ * auVar177._0_4_;
                  auVar80._8_4_ = auVar177._8_4_ * auVar177._8_4_;
                  auVar80._12_4_ = auVar177._12_4_ * auVar177._12_4_;
                  auVar80._16_4_ = auVar177._16_4_ * auVar177._16_4_;
                  auVar80._20_4_ = auVar177._20_4_ * auVar177._20_4_;
                  auVar80._24_4_ = auVar177._24_4_ * auVar177._24_4_;
                  auVar80._28_4_ = auVar182._28_4_;
                  auVar182 = vfmadd213ps_avx512vl(auVar153,auVar177,auVar154);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar177,auVar155);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar177,auVar156);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar177,auVar157);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar177,auVar158);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar177,auVar159);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar177,auVar170);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar177,auVar171);
                  auVar176 = vmulps_avx512vl(auVar80,auVar177);
                  auVar176 = vmulps_avx512vl(auVar176,auVar182);
                  auVar64._8_4_ = 0xffffff82;
                  auVar64._0_8_ = 0xffffff82ffffff82;
                  auVar64._12_4_ = 0xffffff82;
                  auVar64._16_4_ = 0xffffff82;
                  auVar64._20_4_ = 0xffffff82;
                  auVar64._24_4_ = 0xffffff82;
                  auVar64._28_4_ = 0xffffff82;
                  auVar182 = vpaddd_avx512vl(auVar264,auVar64);
                  auVar182 = vcvtdq2ps_avx(auVar182);
                  auVar174 = vsubps_avx512vl(auVar182,auVar218);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar178._0_4_ = (uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar182._0_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar178._4_4_ = (uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar182._4_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar178._8_4_ = (uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar182._8_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar178._12_4_ =
                       (uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar182._12_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 4) & 1);
                  auVar178._16_4_ =
                       (uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar182._16_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 5) & 1);
                  auVar178._20_4_ =
                       (uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar182._20_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 6) & 1);
                  auVar178._24_4_ =
                       (uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar182._24_4_;
                  bVar105 = SUB81(uVar12 >> 7,0);
                  auVar178._28_4_ =
                       (uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar182._28_4_;
                  auVar182 = vfmadd231ps_avx512vl(auVar176,auVar178,auVar301);
                  auVar182 = vfmsub231ps_avx512vl(auVar182,auVar210,auVar80);
                  auVar182 = vsubps_avx512vl(auVar182,auVar177);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar222,auVar178);
                  auVar182 = vmulps_avx512vl(ZEXT1632(auVar107),auVar172);
                  auVar176 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar179._0_4_ = (uint)bVar105 * auVar176._0_4_ | (uint)!bVar105 * auVar182._0_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar179._4_4_ = (uint)bVar105 * auVar176._4_4_ | (uint)!bVar105 * auVar182._4_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar179._8_4_ = (uint)bVar105 * auVar176._8_4_ | (uint)!bVar105 * auVar182._8_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar179._12_4_ =
                       (uint)bVar105 * auVar176._12_4_ | (uint)!bVar105 * auVar182._12_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar179._16_4_ =
                       (uint)bVar105 * auVar176._16_4_ | (uint)!bVar105 * auVar182._16_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar179._20_4_ =
                       (uint)bVar105 * auVar176._20_4_ | (uint)!bVar105 * auVar182._20_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar179._24_4_ =
                       (uint)bVar105 * auVar176._24_4_ | (uint)!bVar105 * auVar182._24_4_;
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar179._28_4_ =
                       (uint)bVar105 * auVar176._28_4_ | (uint)!bVar105 * auVar182._28_4_;
                  auVar182 = vminps_avx(auVar179,auVar201);
                  auVar182 = vmaxps_avx(auVar182,auVar205);
                  auVar107 = vfmadd213ps_fma(auVar214,auVar182,auVar210);
                  auVar176 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar176,1);
                  auVar174 = vsubps_avx512vl(auVar176,auVar218);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar180._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar180._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar180._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar180._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar180._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar180._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar180._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar180._28_4_ =
                       (float)((uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar180,auVar222);
                  auVar107 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar180,auVar301);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar150,auVar176,auVar271);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar277);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar283);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar289);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar210);
                  auVar182 = vfmadd213ps_avx512vl
                                       (auVar182,ZEXT1632(CONCAT412(auVar107._12_4_ *
                                                                    auVar107._12_4_,
                                                                    CONCAT48(auVar107._8_4_ *
                                                                             auVar107._8_4_,
                                                                             CONCAT44(auVar107._4_4_
                                                                                      * auVar107.
                                                  _4_4_,auVar107._0_4_ * auVar107._0_4_)))),auVar176
                                       );
                  auVar176 = vaddps_avx512vl(auVar182,auVar218);
                  auVar265._0_4_ = (int)auVar180._0_4_;
                  auVar265._4_4_ = (int)auVar180._4_4_;
                  auVar265._8_4_ = (int)auVar180._8_4_;
                  auVar265._12_4_ = (int)auVar180._12_4_;
                  auVar265._16_4_ = (int)auVar180._16_4_;
                  auVar265._20_4_ = (int)auVar180._20_4_;
                  auVar265._24_4_ = (int)auVar180._24_4_;
                  auVar265._28_4_ = (int)auVar180._28_4_;
                  auVar182 = vpslld_avx2(auVar265,0x17);
                  auVar182 = vpaddd_avx2(auVar182,auVar295);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar176,auVar218);
                  auVar182 = vrcpps_avx(ZEXT1632(auVar107));
                  auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar182,auVar218);
                  auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar182,auVar182);
                  auVar176 = vfnmadd213ps_avx512vl(ZEXT1632(auVar107),auVar172,auVar152);
                  auVar173._4_4_ = auVar176._4_4_ * auVar198._4_4_;
                  auVar173._0_4_ = auVar176._0_4_ * auVar198._0_4_;
                  auVar173._8_4_ = auVar176._8_4_ * auVar198._8_4_;
                  auVar173._12_4_ = auVar176._12_4_ * auVar198._12_4_;
                  auVar173._16_4_ = auVar176._16_4_ * auVar198._16_4_;
                  auVar173._20_4_ = auVar176._20_4_ * auVar198._20_4_;
                  auVar173._24_4_ = auVar176._24_4_ * auVar198._24_4_;
                  auVar173._28_4_ = auVar182._28_4_;
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar245._4_4_ = uVar1;
                  auVar245._0_4_ = uVar1;
                  auVar245._8_4_ = uVar1;
                  auVar245._12_4_ = uVar1;
                  auVar245._16_4_ = uVar1;
                  auVar245._20_4_ = uVar1;
                  auVar245._24_4_ = uVar1;
                  auVar245._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar61._4_4_ = uVar1;
                  auVar61._0_4_ = uVar1;
                  auVar61._8_4_ = uVar1;
                  auVar61._12_4_ = uVar1;
                  auVar61._16_4_ = uVar1;
                  auVar61._20_4_ = uVar1;
                  auVar61._24_4_ = uVar1;
                  auVar61._28_4_ = uVar1;
                  auVar182 = vfmadd213ps_avx512vl(auVar245,auVar182,auVar61);
                  auVar182 = vmaxps_avx512vl(auVar182,ZEXT1632(auVar106));
                  auVar182 = vminps_avx(auVar182,auVar218);
                  auVar173._4_4_ = auVar182._4_4_ * auVar198._4_4_;
                  auVar173._0_4_ = auVar182._0_4_ * auVar198._0_4_;
                  auVar173._8_4_ = auVar182._8_4_ * auVar198._8_4_;
                  auVar173._12_4_ = auVar182._12_4_ * auVar198._12_4_;
                  auVar173._16_4_ = auVar182._16_4_ * auVar198._16_4_;
                  auVar173._20_4_ = auVar182._20_4_ * auVar198._20_4_;
                  auVar173._24_4_ = auVar182._24_4_ * auVar198._24_4_;
                  auVar173._28_4_ = auVar182._28_4_;
                }
                auVar182 = auVar173;
              }
              *pauVar92 = auVar182;
              pauVar92 = pauVar92 + 1;
            }
          }
        }
        if ((iVar3 == 4) && (_elempack == 8)) {
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = (void *)0x0;
          if (0 < iVar99) {
            pvVar86 = pvVar84;
          }
          auVar202._8_4_ = 0x42b0c0a5;
          auVar202._0_8_ = 0x42b0c0a542b0c0a5;
          auVar202._12_4_ = 0x42b0c0a5;
          auVar202._16_4_ = 0x42b0c0a5;
          auVar202._20_4_ = 0x42b0c0a5;
          auVar202._24_4_ = 0x42b0c0a5;
          auVar202._28_4_ = 0x42b0c0a5;
          auVar206._8_4_ = 0xc2b0c0a5;
          auVar206._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar206._12_4_ = 0xc2b0c0a5;
          auVar206._16_4_ = 0xc2b0c0a5;
          auVar206._20_4_ = 0xc2b0c0a5;
          auVar206._24_4_ = 0xc2b0c0a5;
          auVar206._28_4_ = 0xc2b0c0a5;
          auVar211._8_4_ = 0x3f000000;
          auVar211._0_8_ = 0x3f0000003f000000;
          auVar211._12_4_ = 0x3f000000;
          auVar211._16_4_ = 0x3f000000;
          auVar211._20_4_ = 0x3f000000;
          auVar211._24_4_ = 0x3f000000;
          auVar211._28_4_ = 0x3f000000;
          auVar215._8_4_ = 0x3fb8aa3b;
          auVar215._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar215._12_4_ = 0x3fb8aa3b;
          auVar215._16_4_ = 0x3fb8aa3b;
          auVar215._20_4_ = 0x3fb8aa3b;
          auVar215._24_4_ = 0x3fb8aa3b;
          auVar215._28_4_ = 0x3fb8aa3b;
          auVar219._8_4_ = 0x3f800000;
          auVar219._0_8_ = 0x3f8000003f800000;
          auVar219._12_4_ = 0x3f800000;
          auVar219._16_4_ = 0x3f800000;
          auVar219._20_4_ = 0x3f800000;
          auVar219._24_4_ = 0x3f800000;
          auVar219._28_4_ = 0x3f800000;
          auVar223._8_4_ = 0x3f318000;
          auVar223._0_8_ = 0x3f3180003f318000;
          auVar223._12_4_ = 0x3f318000;
          auVar223._16_4_ = 0x3f318000;
          auVar223._20_4_ = 0x3f318000;
          auVar223._24_4_ = 0x3f318000;
          auVar223._28_4_ = 0x3f318000;
          auVar150 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar272._8_4_ = 0x3ab743ce;
          auVar272._0_8_ = 0x3ab743ce3ab743ce;
          auVar272._12_4_ = 0x3ab743ce;
          auVar272._16_4_ = 0x3ab743ce;
          auVar272._20_4_ = 0x3ab743ce;
          auVar272._24_4_ = 0x3ab743ce;
          auVar272._28_4_ = 0x3ab743ce;
          auVar278._8_4_ = 0x3c088908;
          auVar278._0_8_ = 0x3c0889083c088908;
          auVar278._12_4_ = 0x3c088908;
          auVar278._16_4_ = 0x3c088908;
          auVar278._20_4_ = 0x3c088908;
          auVar278._24_4_ = 0x3c088908;
          auVar278._28_4_ = 0x3c088908;
          auVar284._8_4_ = 0x3d2aa9c1;
          auVar284._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar284._12_4_ = 0x3d2aa9c1;
          auVar284._16_4_ = 0x3d2aa9c1;
          auVar284._20_4_ = 0x3d2aa9c1;
          auVar284._24_4_ = 0x3d2aa9c1;
          auVar284._28_4_ = 0x3d2aa9c1;
          auVar290._8_4_ = 0x3e2aaaaa;
          auVar290._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar290._12_4_ = 0x3e2aaaaa;
          auVar290._16_4_ = 0x3e2aaaaa;
          auVar290._20_4_ = 0x3e2aaaaa;
          auVar290._24_4_ = 0x3e2aaaaa;
          auVar290._28_4_ = 0x3e2aaaaa;
          auVar296._8_4_ = 0x3f800000;
          auVar296._0_8_ = 0x3f8000003f800000;
          auVar296._12_4_ = 0x3f800000;
          auVar296._16_4_ = 0x3f800000;
          auVar296._20_4_ = 0x3f800000;
          auVar296._24_4_ = 0x3f800000;
          auVar296._28_4_ = 0x3f800000;
          auVar302._8_4_ = 0xb95e8083;
          auVar302._0_8_ = 0xb95e8083b95e8083;
          auVar302._12_4_ = 0xb95e8083;
          auVar302._16_4_ = 0xb95e8083;
          auVar302._20_4_ = 0xb95e8083;
          auVar302._24_4_ = 0xb95e8083;
          auVar302._28_4_ = 0xb95e8083;
          auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar152 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar153 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar154 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar155 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar170 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar171 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar106 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
          in_ZMM30 = ZEXT1664(auVar106);
          auVar172 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          for (pvVar90 = (void *)0x0; pvVar90 != pvVar86; pvVar90 = (void *)((long)pvVar90 + 1)) {
            pauVar92 = (undefined1 (*) [32])
                       ((long)top_blob->w * (long)pvVar90 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            for (iVar94 = 0; iVar94 <= iVar101; iVar94 = iVar94 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar198 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var5) +
                                     (long)pvVar90 * 0x20));
              }
              pauVar102 = (undefined1 (*) [32])
                          ((this->weight_data_packed).cstep * (long)pvVar90 *
                           (this->weight_data_packed).elemsize +
                          (long)(this->weight_data_packed).data);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                puVar95 = (undefined4 *)
                          ((long)local_d8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar94 * 4) * 4 +
                          (long)local_d8.w *
                          CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97);
                iVar91 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (iVar91 < 1) {
                  iVar91 = 0;
                }
                while (bVar105 = iVar91 != 0, iVar91 = iVar91 + -1, bVar105) {
                  uVar1 = *puVar95;
                  auVar246._4_4_ = uVar1;
                  auVar246._0_4_ = uVar1;
                  auVar246._8_4_ = uVar1;
                  auVar246._12_4_ = uVar1;
                  auVar246._16_4_ = uVar1;
                  auVar246._20_4_ = uVar1;
                  auVar246._24_4_ = uVar1;
                  auVar246._28_4_ = uVar1;
                  uVar1 = puVar95[1];
                  auVar266._4_4_ = uVar1;
                  auVar266._0_4_ = uVar1;
                  auVar266._8_4_ = uVar1;
                  auVar266._12_4_ = uVar1;
                  auVar266._16_4_ = uVar1;
                  auVar266._20_4_ = uVar1;
                  auVar266._24_4_ = uVar1;
                  auVar266._28_4_ = uVar1;
                  uVar1 = puVar95[2];
                  auVar321._4_4_ = uVar1;
                  auVar321._0_4_ = uVar1;
                  auVar321._8_4_ = uVar1;
                  auVar321._12_4_ = uVar1;
                  auVar321._16_4_ = uVar1;
                  auVar321._20_4_ = uVar1;
                  auVar321._24_4_ = uVar1;
                  auVar321._28_4_ = uVar1;
                  auVar182 = vbroadcastss_avx512vl(ZEXT416((uint)puVar95[3]));
                  auVar107 = vfmadd231ps_fma(auVar198._0_32_,auVar246,*pauVar102);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar266,pauVar102[1]);
                  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar321,pauVar102[2]);
                  auVar182 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar182,pauVar102[3]);
                  auVar198 = ZEXT3264(auVar182);
                  puVar95 = puVar95 + (long)*(int *)(&this->field_0xd8 + (long)p_Var7) * 4;
                  pauVar102 = pauVar102 + 4;
                }
              }
              auVar182 = auVar198._0_32_;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                auVar183 = vmaxps_avx512vl(auVar182,ZEXT1632(auVar106));
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 2:
                  auVar182 = vminps_avx512vl(auVar182,ZEXT1632(auVar106));
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar78._4_4_ = uVar1;
                  auVar78._0_4_ = uVar1;
                  auVar78._8_4_ = uVar1;
                  auVar78._12_4_ = uVar1;
                  auVar78._16_4_ = uVar1;
                  auVar78._20_4_ = uVar1;
                  auVar78._24_4_ = uVar1;
                  auVar78._28_4_ = uVar1;
                  auVar183 = vfmadd231ps_avx512vl(auVar183,auVar182,auVar78);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar76._4_4_ = uVar1;
                  auVar76._0_4_ = uVar1;
                  auVar76._8_4_ = uVar1;
                  auVar76._12_4_ = uVar1;
                  auVar76._16_4_ = uVar1;
                  auVar76._20_4_ = uVar1;
                  auVar76._24_4_ = uVar1;
                  auVar76._28_4_ = uVar1;
                  auVar182 = vmaxps_avx512vl(auVar182,auVar76);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar77._4_4_ = uVar1;
                  auVar77._0_4_ = uVar1;
                  auVar77._8_4_ = uVar1;
                  auVar77._12_4_ = uVar1;
                  auVar77._16_4_ = uVar1;
                  auVar77._20_4_ = uVar1;
                  auVar77._24_4_ = uVar1;
                  auVar77._28_4_ = uVar1;
                  auVar183 = vminps_avx512vl(auVar182,auVar77);
                  break;
                case 4:
                  auVar74._8_4_ = 0x80000000;
                  auVar74._0_8_ = 0x8000000080000000;
                  auVar74._12_4_ = 0x80000000;
                  auVar74._16_4_ = 0x80000000;
                  auVar74._20_4_ = 0x80000000;
                  auVar74._24_4_ = 0x80000000;
                  auVar74._28_4_ = 0x80000000;
                  auVar182 = vxorps_avx512vl(auVar182,auVar74);
                  auVar182 = vminps_avx(auVar182,auVar202);
                  auVar182 = vmaxps_avx(auVar182,auVar206);
                  auVar107 = vfmadd231ps_fma(auVar211,auVar182,auVar215);
                  auVar176 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar176,1);
                  auVar174 = vsubps_avx512vl(auVar176,auVar219);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar189._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar189._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar189._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar189._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar189._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar189._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar189._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar189._28_4_ =
                       (float)((uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar189,auVar223);
                  auVar75._8_4_ = 0x395e8083;
                  auVar75._0_8_ = 0x395e8083395e8083;
                  auVar75._12_4_ = 0x395e8083;
                  auVar75._16_4_ = 0x395e8083;
                  auVar75._20_4_ = 0x395e8083;
                  auVar75._24_4_ = 0x395e8083;
                  auVar75._28_4_ = 0x395e8083;
                  auVar182 = vfmsub231ps_avx512vl(ZEXT1632(auVar107),auVar189,auVar75);
                  auVar247._0_4_ = auVar182._0_4_ * auVar182._0_4_;
                  auVar247._4_4_ = auVar182._4_4_ * auVar182._4_4_;
                  auVar247._8_4_ = auVar182._8_4_ * auVar182._8_4_;
                  auVar247._12_4_ = auVar182._12_4_ * auVar182._12_4_;
                  auVar247._16_4_ = auVar182._16_4_ * auVar182._16_4_;
                  auVar247._20_4_ = auVar182._20_4_ * auVar182._20_4_;
                  auVar247._24_4_ = auVar182._24_4_ * auVar182._24_4_;
                  auVar247._28_4_ = 0;
                  auVar107 = vfmadd213ps_fma(auVar150,auVar182,auVar272);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar278);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar284);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar290);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar182,auVar211);
                  auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar247,auVar182);
                  auVar197._0_4_ = auVar107._0_4_ + 1.0;
                  auVar197._4_4_ = auVar107._4_4_ + 1.0;
                  auVar197._8_4_ = auVar107._8_4_ + 1.0;
                  auVar197._12_4_ = auVar107._12_4_ + 1.0;
                  auVar197._16_4_ = 0x3f800000;
                  auVar197._20_4_ = 0x3f800000;
                  auVar197._24_4_ = 0x3f800000;
                  auVar197._28_4_ = 0x3f800000;
                  auVar248._0_4_ = (int)auVar189._0_4_;
                  auVar248._4_4_ = (int)auVar189._4_4_;
                  auVar248._8_4_ = (int)auVar189._8_4_;
                  auVar248._12_4_ = (int)auVar189._12_4_;
                  auVar248._16_4_ = (int)auVar189._16_4_;
                  auVar248._20_4_ = (int)auVar189._20_4_;
                  auVar248._24_4_ = (int)auVar189._24_4_;
                  auVar248._28_4_ = (int)auVar189._28_4_;
                  auVar182 = vpslld_avx2(auVar248,0x17);
                  auVar182 = vpaddd_avx2(auVar296,auVar182);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar197,auVar219);
                  auVar182 = vrcpps_avx(ZEXT1632(auVar107));
                  auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar182,auVar219);
                  auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar182,auVar182);
                  auVar183 = ZEXT1632(auVar107);
                  break;
                case 5:
                  auVar182 = vminps_avx(auVar182,auVar202);
                  auVar182 = vmaxps_avx(auVar182,auVar206);
                  auVar107 = vfmadd213ps_fma(auVar215,auVar182,auVar211);
                  auVar176 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar176,1);
                  auVar174 = vsubps_avx512vl(auVar176,auVar219);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar184._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar184._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar184._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar184._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar184._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar184._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar184._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar184._28_4_ =
                       (float)((uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar184,auVar223);
                  auVar107 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar184,auVar302);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar150,auVar176,auVar272);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar278);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar284);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar290);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar211);
                  auVar182 = vfmadd213ps_avx512vl
                                       (auVar182,ZEXT1632(CONCAT412(auVar107._12_4_ *
                                                                    auVar107._12_4_,
                                                                    CONCAT48(auVar107._8_4_ *
                                                                             auVar107._8_4_,
                                                                             CONCAT44(auVar107._4_4_
                                                                                      * auVar107.
                                                  _4_4_,auVar107._0_4_ * auVar107._0_4_)))),auVar176
                                       );
                  auVar176 = vaddps_avx512vl(auVar182,auVar219);
                  auVar267._0_4_ = (int)auVar184._0_4_;
                  auVar267._4_4_ = (int)auVar184._4_4_;
                  auVar267._8_4_ = (int)auVar184._8_4_;
                  auVar267._12_4_ = (int)auVar184._12_4_;
                  auVar267._16_4_ = (int)auVar184._16_4_;
                  auVar267._20_4_ = (int)auVar184._20_4_;
                  auVar267._24_4_ = (int)auVar184._24_4_;
                  auVar267._28_4_ = (int)auVar184._28_4_;
                  auVar182 = vpslld_avx2(auVar267,0x17);
                  auVar182 = vpaddd_avx2(auVar182,auVar296);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar176,auVar219);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),ZEXT1632(auVar106),2);
                  auVar71._8_4_ = 0x800000;
                  auVar71._0_8_ = 0x80000000800000;
                  auVar71._12_4_ = 0x800000;
                  auVar71._16_4_ = 0x800000;
                  auVar71._20_4_ = 0x800000;
                  auVar71._24_4_ = 0x800000;
                  auVar71._28_4_ = 0x800000;
                  auVar182 = vmaxps_avx512vl(ZEXT1632(auVar107),auVar71);
                  auVar264 = vpsrld_avx2(auVar182,0x17);
                  auVar322._8_4_ = 0x807fffff;
                  auVar322._0_8_ = 0x807fffff807fffff;
                  auVar322._12_4_ = 0x807fffff;
                  auVar322._16_4_ = 0x807fffff;
                  auVar322._20_4_ = 0x807fffff;
                  auVar322._24_4_ = 0x807fffff;
                  auVar322._28_4_ = 0x807fffff;
                  auVar72._8_4_ = 0x3f000000;
                  auVar72._0_8_ = 0x3f0000003f000000;
                  auVar72._12_4_ = 0x3f000000;
                  auVar72._16_4_ = 0x3f000000;
                  auVar72._20_4_ = 0x3f000000;
                  auVar72._24_4_ = 0x3f000000;
                  auVar72._28_4_ = 0x3f000000;
                  auVar182 = vpternlogd_avx512vl(auVar182,auVar322,auVar72,0xea);
                  uVar12 = vcmpps_avx512vl(auVar182,auVar151,1);
                  auVar176 = vaddps_avx512vl(auVar182,auVar152);
                  auVar174 = vaddps_avx512vl(auVar176,auVar182);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar185._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar185._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar185._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar185._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 4) & 1);
                  auVar185._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 5) & 1);
                  auVar185._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 6) & 1);
                  auVar185._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar12 >> 7,0);
                  auVar185._28_4_ =
                       (uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_;
                  auVar81._4_4_ = auVar185._4_4_ * auVar185._4_4_;
                  auVar81._0_4_ = auVar185._0_4_ * auVar185._0_4_;
                  auVar81._8_4_ = auVar185._8_4_ * auVar185._8_4_;
                  auVar81._12_4_ = auVar185._12_4_ * auVar185._12_4_;
                  auVar81._16_4_ = auVar185._16_4_ * auVar185._16_4_;
                  auVar81._20_4_ = auVar185._20_4_ * auVar185._20_4_;
                  auVar81._24_4_ = auVar185._24_4_ * auVar185._24_4_;
                  auVar81._28_4_ = auVar182._28_4_;
                  auVar182 = vfmadd213ps_avx512vl(auVar153,auVar185,auVar154);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar185,auVar155);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar185,auVar156);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar185,auVar157);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar185,auVar158);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar185,auVar159);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar185,auVar170);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar185,auVar171);
                  auVar176 = vmulps_avx512vl(auVar81,auVar185);
                  auVar176 = vmulps_avx512vl(auVar176,auVar182);
                  auVar73._8_4_ = 0xffffff82;
                  auVar73._0_8_ = 0xffffff82ffffff82;
                  auVar73._12_4_ = 0xffffff82;
                  auVar73._16_4_ = 0xffffff82;
                  auVar73._20_4_ = 0xffffff82;
                  auVar73._24_4_ = 0xffffff82;
                  auVar73._28_4_ = 0xffffff82;
                  auVar182 = vpaddd_avx512vl(auVar264,auVar73);
                  auVar182 = vcvtdq2ps_avx(auVar182);
                  auVar174 = vsubps_avx512vl(auVar182,auVar219);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar186._0_4_ = (uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar182._0_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar186._4_4_ = (uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar182._4_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar186._8_4_ = (uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar182._8_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar186._12_4_ =
                       (uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar182._12_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 4) & 1);
                  auVar186._16_4_ =
                       (uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar182._16_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 5) & 1);
                  auVar186._20_4_ =
                       (uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar182._20_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 6) & 1);
                  auVar186._24_4_ =
                       (uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar182._24_4_;
                  bVar105 = SUB81(uVar12 >> 7,0);
                  auVar186._28_4_ =
                       (uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar182._28_4_;
                  auVar182 = vfmadd231ps_avx512vl(auVar176,auVar186,auVar302);
                  auVar182 = vfmsub231ps_avx512vl(auVar182,auVar211,auVar81);
                  auVar182 = vsubps_avx512vl(auVar182,auVar185);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar223,auVar186);
                  auVar182 = vmulps_avx512vl(ZEXT1632(auVar107),auVar172);
                  auVar176 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar187._0_4_ = (uint)bVar105 * auVar176._0_4_ | (uint)!bVar105 * auVar182._0_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar187._4_4_ = (uint)bVar105 * auVar176._4_4_ | (uint)!bVar105 * auVar182._4_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar187._8_4_ = (uint)bVar105 * auVar176._8_4_ | (uint)!bVar105 * auVar182._8_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar187._12_4_ =
                       (uint)bVar105 * auVar176._12_4_ | (uint)!bVar105 * auVar182._12_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar187._16_4_ =
                       (uint)bVar105 * auVar176._16_4_ | (uint)!bVar105 * auVar182._16_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar187._20_4_ =
                       (uint)bVar105 * auVar176._20_4_ | (uint)!bVar105 * auVar182._20_4_;
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar187._24_4_ =
                       (uint)bVar105 * auVar176._24_4_ | (uint)!bVar105 * auVar182._24_4_;
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar187._28_4_ =
                       (uint)bVar105 * auVar176._28_4_ | (uint)!bVar105 * auVar182._28_4_;
                  auVar182 = vminps_avx(auVar187,auVar202);
                  auVar182 = vmaxps_avx(auVar182,auVar206);
                  auVar107 = vfmadd213ps_fma(auVar215,auVar182,auVar211);
                  auVar176 = vroundps_avx(ZEXT1632(auVar107),1);
                  uVar97 = vcmpps_avx512vl(ZEXT1632(auVar107),auVar176,1);
                  auVar174 = vsubps_avx512vl(auVar176,auVar219);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar188._0_4_ =
                       (float)((uint)bVar105 * auVar174._0_4_ | (uint)!bVar105 * auVar176._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar188._4_4_ =
                       (float)((uint)bVar105 * auVar174._4_4_ | (uint)!bVar105 * auVar176._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar188._8_4_ =
                       (float)((uint)bVar105 * auVar174._8_4_ | (uint)!bVar105 * auVar176._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar188._12_4_ =
                       (float)((uint)bVar105 * auVar174._12_4_ | (uint)!bVar105 * auVar176._12_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar188._16_4_ =
                       (float)((uint)bVar105 * auVar174._16_4_ | (uint)!bVar105 * auVar176._16_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar188._20_4_ =
                       (float)((uint)bVar105 * auVar174._20_4_ | (uint)!bVar105 * auVar176._20_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar188._24_4_ =
                       (float)((uint)bVar105 * auVar174._24_4_ | (uint)!bVar105 * auVar176._24_4_);
                  bVar105 = SUB81(uVar97 >> 7,0);
                  auVar188._28_4_ =
                       (float)((uint)bVar105 * auVar174._28_4_ | (uint)!bVar105 * auVar176._28_4_);
                  auVar107 = vfmsub231ps_fma(auVar182,auVar188,auVar223);
                  auVar107 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar188,auVar302);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar150,auVar176,auVar272);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar278);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar284);
                  auVar176 = ZEXT1632(auVar107);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar290);
                  auVar182 = vfmadd213ps_avx512vl(auVar182,auVar176,auVar211);
                  auVar182 = vfmadd213ps_avx512vl
                                       (auVar182,ZEXT1632(CONCAT412(auVar107._12_4_ *
                                                                    auVar107._12_4_,
                                                                    CONCAT48(auVar107._8_4_ *
                                                                             auVar107._8_4_,
                                                                             CONCAT44(auVar107._4_4_
                                                                                      * auVar107.
                                                  _4_4_,auVar107._0_4_ * auVar107._0_4_)))),auVar176
                                       );
                  auVar176 = vaddps_avx512vl(auVar182,auVar219);
                  auVar268._0_4_ = (int)auVar188._0_4_;
                  auVar268._4_4_ = (int)auVar188._4_4_;
                  auVar268._8_4_ = (int)auVar188._8_4_;
                  auVar268._12_4_ = (int)auVar188._12_4_;
                  auVar268._16_4_ = (int)auVar188._16_4_;
                  auVar268._20_4_ = (int)auVar188._20_4_;
                  auVar268._24_4_ = (int)auVar188._24_4_;
                  auVar268._28_4_ = (int)auVar188._28_4_;
                  auVar182 = vpslld_avx2(auVar268,0x17);
                  auVar182 = vpaddd_avx2(auVar182,auVar296);
                  auVar107 = vfmadd213ps_fma(auVar182,auVar176,auVar219);
                  auVar182 = vrcpps_avx(ZEXT1632(auVar107));
                  auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar182,auVar219);
                  auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar182,auVar182);
                  auVar176 = vfnmadd213ps_avx512vl(ZEXT1632(auVar107),auVar172,auVar152);
                  auVar183._4_4_ = auVar176._4_4_ * auVar198._4_4_;
                  auVar183._0_4_ = auVar176._0_4_ * auVar198._0_4_;
                  auVar183._8_4_ = auVar176._8_4_ * auVar198._8_4_;
                  auVar183._12_4_ = auVar176._12_4_ * auVar198._12_4_;
                  auVar183._16_4_ = auVar176._16_4_ * auVar198._16_4_;
                  auVar183._20_4_ = auVar176._20_4_ * auVar198._20_4_;
                  auVar183._24_4_ = auVar176._24_4_ * auVar198._24_4_;
                  auVar183._28_4_ = auVar182._28_4_;
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar249._4_4_ = uVar1;
                  auVar249._0_4_ = uVar1;
                  auVar249._8_4_ = uVar1;
                  auVar249._12_4_ = uVar1;
                  auVar249._16_4_ = uVar1;
                  auVar249._20_4_ = uVar1;
                  auVar249._24_4_ = uVar1;
                  auVar249._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar70._16_4_ = uVar1;
                  auVar70._20_4_ = uVar1;
                  auVar70._24_4_ = uVar1;
                  auVar70._28_4_ = uVar1;
                  auVar182 = vfmadd213ps_avx512vl(auVar249,auVar182,auVar70);
                  auVar182 = vmaxps_avx512vl(auVar182,ZEXT1632(auVar106));
                  auVar182 = vminps_avx(auVar182,auVar219);
                  auVar183._4_4_ = auVar182._4_4_ * auVar198._4_4_;
                  auVar183._0_4_ = auVar182._0_4_ * auVar198._0_4_;
                  auVar183._8_4_ = auVar182._8_4_ * auVar198._8_4_;
                  auVar183._12_4_ = auVar182._12_4_ * auVar198._12_4_;
                  auVar183._16_4_ = auVar182._16_4_ * auVar198._16_4_;
                  auVar183._20_4_ = auVar182._20_4_ * auVar198._20_4_;
                  auVar183._24_4_ = auVar182._24_4_ * auVar198._24_4_;
                  auVar183._28_4_ = auVar182._28_4_;
                }
                auVar182 = auVar183;
              }
              *pauVar92 = auVar182;
              pauVar92 = pauVar92 + 1;
            }
          }
        }
        auVar106 = in_ZMM30._0_16_;
        lVar85 = (long)iVar101;
        if ((iVar3 == 8) && (_elempack == 1)) {
          local_90 = top_blob->data;
          local_80 = (long)top_blob->w * top_blob->elemsize;
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          local_88 = (void *)0x0;
          if (0 < iVar99) {
            local_88 = pvVar84;
          }
          for (pvVar86 = (void *)0x0; pvVar90 = local_90, auVar106 = in_ZMM30._0_16_,
              pvVar86 != local_88; pvVar86 = (void *)((long)pvVar86 + 1)) {
            lVar88 = local_80 * (long)pvVar86;
            sVar8 = (this->weight_data_packed).cstep;
            sVar9 = (this->weight_data_packed).elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            pvVar10 = (this->weight_data_packed).data;
            for (lVar103 = 0; lVar103 <= lVar85; lVar103 = lVar103 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                fVar191 = 0.0;
              }
              else {
                fVar191 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var5) +
                                    (long)pvVar86 * 4);
              }
              auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
              pauVar92 = (undefined1 (*) [32])(sVar8 * (long)pvVar86 * sVar9 + (long)pvVar10);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                pauVar102 = (undefined1 (*) [32])
                            ((long)local_d8.data +
                            (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * (int)lVar103 * 8) *
                            4 + (long)local_d8.w *
                                CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97);
                iVar94 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                  iVar94 = 0;
                }
                while (bVar105 = iVar94 != 0, iVar94 = iVar94 + -1, bVar105) {
                  auVar106 = vfmadd231ps_fma(auVar198._0_32_,*pauVar92,*pauVar102);
                  auVar198 = ZEXT1664(auVar106);
                  pauVar102 = pauVar102 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                  pauVar92 = pauVar92 + 1;
                }
              }
              auVar107._0_4_ = auVar198._16_4_ + auVar198._0_4_;
              auVar107._4_4_ = auVar198._20_4_ + auVar198._4_4_;
              auVar107._8_4_ = auVar198._24_4_ + auVar198._8_4_;
              auVar107._12_4_ = auVar198._28_4_ + auVar198._12_4_;
              auVar106 = vshufpd_avx(auVar107,auVar107,1);
              auVar108._0_4_ = auVar106._0_4_ + auVar107._0_4_;
              auVar108._4_4_ = auVar106._4_4_ + auVar107._4_4_;
              auVar108._8_4_ = auVar106._8_4_ + auVar107._8_4_;
              auVar108._12_4_ = auVar106._12_4_ + auVar107._12_4_;
              auVar106 = vmovshdup_avx(auVar108);
              fVar191 = auVar106._0_4_ + fVar191 + auVar108._0_4_;
              fVar190 = fVar191;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                auVar106 = ZEXT416((uint)fVar191);
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 1:
                  auVar106 = vmaxss_avx(auVar106,ZEXT416(0));
                  fVar190 = auVar106._0_4_;
                  break;
                case 2:
                  uVar13 = vcmpss_avx512f(auVar106,ZEXT416(0),0xe);
                  bVar105 = (bool)((byte)uVar13 & 1);
                  fVar190 = (float)((uint)bVar105 * 0x3f800000 +
                                   (uint)!bVar105 * **(int **)(&this->field_0xf8 + (long)p_Var5)) *
                            fVar191;
                  break;
                case 3:
                  fVar191 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar106 = vmaxss_avx(auVar106,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                    (long)p_Var5)));
                  fVar190 = auVar106._0_4_;
                  if (fVar191 < auVar106._0_4_) {
                    fVar190 = fVar191;
                  }
                  break;
                case 4:
                  auVar106 = vminss_avx(auVar106,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar109._8_4_ = 0x80000000;
                  auVar109._0_8_ = 0x8000000080000000;
                  auVar109._12_4_ = 0x80000000;
                  auVar107 = vxorps_avx512vl(auVar106,auVar109);
                  uVar13 = vcmpss_avx512f(auVar106,ZEXT416(0xc2b0c0a5),1);
                  bVar105 = (bool)((byte)uVar13 & 1);
                  fVar191 = expf((float)((uint)bVar105 * 0x42b0c0a5 +
                                        (uint)!bVar105 * auVar107._0_4_));
                  fVar190 = 1.0 / (fVar191 + 1.0);
                  break;
                case 5:
                  fVar190 = expf(fVar191);
                  fVar190 = logf(fVar190 + 1.0);
                  fVar190 = tanhf(fVar190);
                  fVar190 = fVar190 * fVar191;
                  break;
                case 6:
                  fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                  auVar106._8_4_ = 0x80000000;
                  auVar106._0_8_ = 0x8000000080000000;
                  auVar106._12_4_ = 0x80000000;
                  auVar107 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var5))[1]);
                  auVar106 = vxorps_avx512vl(auVar107,auVar106);
                  fVar207 = auVar106._0_4_ / fVar2;
                  fVar190 = 0.0;
                  if ((fVar207 <= fVar191) && (fVar190 = fVar191, fVar191 <= fVar207 + 1.0 / fVar2))
                  {
                    auVar106 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar191),auVar107)
                    ;
                    fVar190 = auVar106._0_4_ * fVar191;
                  }
                }
              }
              *(float *)((long)pvVar90 + lVar103 * 4 + lVar88) = fVar190;
            }
          }
        }
        if ((iVar3 == 8) && (_elempack == 4)) {
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = (void *)0x0;
          if (0 < iVar99) {
            pvVar86 = pvVar84;
          }
          auVar129._8_4_ = 0x42b0c0a5;
          auVar129._0_8_ = 0x42b0c0a542b0c0a5;
          auVar129._12_4_ = 0x42b0c0a5;
          auVar130._8_4_ = 0xc2b0c0a5;
          auVar130._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar130._12_4_ = 0xc2b0c0a5;
          auVar131._8_4_ = 0x3f000000;
          auVar131._0_8_ = 0x3f0000003f000000;
          auVar131._12_4_ = 0x3f000000;
          auVar132._8_4_ = 0x3fb8aa3b;
          auVar132._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar132._12_4_ = 0x3fb8aa3b;
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar136._8_4_ = 0x3f318000;
          auVar136._0_8_ = 0x3f3180003f318000;
          auVar136._12_4_ = 0x3f318000;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar134._8_4_ = 0x3ab743ce;
          auVar134._0_8_ = 0x3ab743ce3ab743ce;
          auVar134._12_4_ = 0x3ab743ce;
          auVar273._8_4_ = 0x3c088908;
          auVar273._0_8_ = 0x3c0889083c088908;
          auVar273._12_4_ = 0x3c088908;
          auVar279._8_4_ = 0x3d2aa9c1;
          auVar279._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar279._12_4_ = 0x3d2aa9c1;
          auVar285._8_4_ = 0x3e2aaaaa;
          auVar285._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar285._12_4_ = 0x3e2aaaaa;
          auVar291._8_4_ = 0x3f800000;
          auVar291._0_8_ = 0x3f8000003f800000;
          auVar291._12_4_ = 0x3f800000;
          auVar297._8_4_ = 0xb95e8083;
          auVar297._0_8_ = 0xb95e8083b95e8083;
          auVar297._12_4_ = 0xb95e8083;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar106 = vxorps_avx512vl(auVar106,auVar106);
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          for (pvVar90 = (void *)0x0; pvVar90 != pvVar86; pvVar90 = (void *)((long)pvVar90 + 1)) {
            pauVar93 = (undefined1 (*) [16])
                       ((long)top_blob->w * (long)pvVar90 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            for (iVar94 = 0; iVar94 <= iVar101; iVar94 = iVar94 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar122 = ZEXT816(0) << 0x40;
              }
              else {
                auVar122 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var5) + (long)pvVar90 * 0x10);
              }
              auVar198 = ZEXT1664(auVar122);
              pauVar104 = (undefined1 (*) [16])
                          ((this->weight_data_packed).cstep * (long)pvVar90 *
                           (this->weight_data_packed).elemsize +
                          (long)(this->weight_data_packed).data);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                puVar95 = (undefined4 *)
                          ((long)local_d8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar94 * 8) * 4 +
                          (long)local_d8.w *
                          CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97);
                iVar91 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                  iVar91 = 0;
                }
                while (bVar105 = iVar91 != 0, iVar91 = iVar91 + -1, bVar105) {
                  uVar1 = *puVar95;
                  auVar122._4_4_ = uVar1;
                  auVar122._0_4_ = uVar1;
                  auVar122._8_4_ = uVar1;
                  auVar122._12_4_ = uVar1;
                  uVar1 = puVar95[1];
                  auVar250._4_4_ = uVar1;
                  auVar250._0_4_ = uVar1;
                  auVar250._8_4_ = uVar1;
                  auVar250._12_4_ = uVar1;
                  uVar1 = puVar95[2];
                  auVar303._4_4_ = uVar1;
                  auVar303._0_4_ = uVar1;
                  auVar303._8_4_ = uVar1;
                  auVar303._12_4_ = uVar1;
                  auVar117 = vbroadcastss_avx512vl(ZEXT416((uint)puVar95[3]));
                  auVar118 = vbroadcastss_avx512vl(ZEXT416((uint)puVar95[4]));
                  auVar119 = vbroadcastss_avx512vl(ZEXT416((uint)puVar95[5]));
                  auVar120 = vbroadcastss_avx512vl(ZEXT416((uint)puVar95[6]));
                  auVar121 = vbroadcastss_avx512vl(ZEXT416((uint)puVar95[7]));
                  auVar122 = vfmadd231ps_fma(auVar198._0_16_,auVar122,*pauVar104);
                  auVar122 = vfmadd231ps_fma(auVar122,auVar250,pauVar104[1]);
                  auVar122 = vfmadd231ps_fma(auVar122,auVar303,pauVar104[2]);
                  auVar122 = vfmadd231ps_avx512vl(auVar122,auVar117,pauVar104[3]);
                  auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,pauVar104[4]);
                  auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,pauVar104[5]);
                  auVar122 = vfmadd231ps_avx512vl(auVar122,auVar120,pauVar104[6]);
                  auVar122 = vfmadd231ps_avx512vl(auVar122,auVar121,pauVar104[7]);
                  auVar198 = ZEXT1664(auVar122);
                  puVar95 = puVar95 + (long)*(int *)(&this->field_0xd8 + (long)p_Var7) * 8;
                  pauVar104 = pauVar104 + 8;
                }
              }
              auVar122 = auVar198._0_16_;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                auVar117 = vmaxps_avx512vl(auVar122,auVar106);
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 2:
                  auVar122 = vminps_avx512vl(auVar122,auVar106);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar26._4_4_ = uVar1;
                  auVar26._0_4_ = uVar1;
                  auVar26._8_4_ = uVar1;
                  auVar26._12_4_ = uVar1;
                  auVar117 = vfmadd231ps_avx512vl(auVar117,auVar122,auVar26);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar24._4_4_ = uVar1;
                  auVar24._0_4_ = uVar1;
                  auVar24._8_4_ = uVar1;
                  auVar24._12_4_ = uVar1;
                  auVar122 = vmaxps_avx512vl(auVar122,auVar24);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar25._4_4_ = uVar1;
                  auVar25._0_4_ = uVar1;
                  auVar25._8_4_ = uVar1;
                  auVar25._12_4_ = uVar1;
                  auVar117 = vminps_avx512vl(auVar122,auVar25);
                  break;
                case 4:
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar122 = vxorps_avx512vl(auVar122,auVar22);
                  auVar122 = vminps_avx(auVar122,auVar129);
                  auVar117 = vmaxps_avx(auVar122,auVar130);
                  auVar118 = vfmadd231ps_fma(auVar131,auVar117,auVar132);
                  auVar308._0_4_ = (int)auVar118._0_4_;
                  auVar308._4_4_ = (int)auVar118._4_4_;
                  auVar308._8_4_ = (int)auVar118._8_4_;
                  auVar308._12_4_ = (int)auVar118._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar308);
                  uVar97 = vcmpps_avx512vl(auVar118,auVar122,1);
                  auVar118 = vsubps_avx512vl(auVar122,auVar137);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar128._0_4_ =
                       (float)((uint)bVar105 * auVar118._0_4_ | (uint)!bVar105 * auVar122._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar128._4_4_ =
                       (float)((uint)bVar105 * auVar118._4_4_ | (uint)!bVar105 * auVar122._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar128._8_4_ =
                       (float)((uint)bVar105 * auVar118._8_4_ | (uint)!bVar105 * auVar122._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar128._12_4_ =
                       (float)((uint)bVar105 * auVar118._12_4_ | (uint)!bVar105 * auVar122._12_4_);
                  auVar122 = vfmsub231ps_fma(auVar117,auVar128,auVar136);
                  auVar23._8_4_ = 0x395e8083;
                  auVar23._0_8_ = 0x395e8083395e8083;
                  auVar23._12_4_ = 0x395e8083;
                  auVar117 = vfmsub231ps_avx512vl(auVar122,auVar128,auVar23);
                  auVar226._0_4_ = auVar117._0_4_ * auVar117._0_4_;
                  auVar226._4_4_ = auVar117._4_4_ * auVar117._4_4_;
                  auVar226._8_4_ = auVar117._8_4_ * auVar117._8_4_;
                  auVar226._12_4_ = auVar117._12_4_ * auVar117._12_4_;
                  auVar122 = vfmadd213ps_fma(auVar107,auVar117,auVar134);
                  auVar122 = vfmadd213ps_fma(auVar122,auVar117,auVar273);
                  auVar122 = vfmadd213ps_fma(auVar122,auVar117,auVar279);
                  auVar122 = vfmadd213ps_fma(auVar122,auVar117,auVar285);
                  auVar122 = vfmadd213ps_fma(auVar122,auVar117,auVar131);
                  auVar122 = vfmadd213ps_fma(auVar122,auVar226,auVar117);
                  auVar192._0_4_ = auVar122._0_4_ + 1.0;
                  auVar192._4_4_ = auVar122._4_4_ + 1.0;
                  auVar192._8_4_ = auVar122._8_4_ + 1.0;
                  auVar192._12_4_ = auVar122._12_4_ + 1.0;
                  auVar227._0_4_ = (int)auVar128._0_4_;
                  auVar227._4_4_ = (int)auVar128._4_4_;
                  auVar227._8_4_ = (int)auVar128._8_4_;
                  auVar227._12_4_ = (int)auVar128._12_4_;
                  auVar122 = vpslld_avx(auVar227,0x17);
                  auVar122 = vpaddd_avx(auVar291,auVar122);
                  auVar117 = vfmadd213ps_fma(auVar122,auVar192,auVar137);
                  auVar122 = vrcpps_avx(auVar117);
                  auVar117 = vfmsub213ps_fma(auVar117,auVar122,auVar137);
                  auVar117 = vfnmadd132ps_fma(auVar117,auVar122,auVar122);
                  break;
                case 5:
                  auVar117 = vminps_avx(auVar122,auVar129);
                  auVar118 = vmaxps_avx(auVar117,auVar130);
                  auVar119 = vfmadd213ps_fma(auVar132,auVar118,auVar131);
                  auVar304._0_4_ = (int)auVar119._0_4_;
                  auVar304._4_4_ = (int)auVar119._4_4_;
                  auVar304._8_4_ = (int)auVar119._8_4_;
                  auVar304._12_4_ = (int)auVar119._12_4_;
                  auVar117 = vcvtdq2ps_avx(auVar304);
                  uVar97 = vcmpps_avx512vl(auVar119,auVar117,1);
                  auVar119 = vsubps_avx512vl(auVar117,auVar137);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar123._0_4_ =
                       (float)((uint)bVar105 * auVar119._0_4_ | (uint)!bVar105 * auVar117._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar123._4_4_ =
                       (float)((uint)bVar105 * auVar119._4_4_ | (uint)!bVar105 * auVar117._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar123._8_4_ =
                       (float)((uint)bVar105 * auVar119._8_4_ | (uint)!bVar105 * auVar117._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar123._12_4_ =
                       (float)((uint)bVar105 * auVar119._12_4_ | (uint)!bVar105 * auVar117._12_4_);
                  auVar117 = vfmsub231ps_fma(auVar118,auVar123,auVar136);
                  auVar117 = vfnmsub231ps_fma(auVar117,auVar123,auVar297);
                  auVar251._0_4_ = auVar117._0_4_ * auVar117._0_4_;
                  auVar251._4_4_ = auVar117._4_4_ * auVar117._4_4_;
                  auVar251._8_4_ = auVar117._8_4_ * auVar117._8_4_;
                  auVar251._12_4_ = auVar117._12_4_ * auVar117._12_4_;
                  auVar118 = vfmadd213ps_avx512vl(auVar107,auVar117,auVar134);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar273);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar279);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar285);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar131);
                  auVar117 = vfmadd213ps_avx512vl(auVar118,auVar251,auVar117);
                  auVar118 = vaddps_avx512vl(auVar117,auVar137);
                  auVar252._0_4_ = (int)auVar123._0_4_;
                  auVar252._4_4_ = (int)auVar123._4_4_;
                  auVar252._8_4_ = (int)auVar123._8_4_;
                  auVar252._12_4_ = (int)auVar123._12_4_;
                  auVar117 = vpslld_avx(auVar252,0x17);
                  auVar117 = vpaddd_avx(auVar117,auVar291);
                  auVar117 = vfmadd213ps_fma(auVar117,auVar118,auVar137);
                  uVar97 = vcmpps_avx512vl(auVar117,auVar106,2);
                  auVar120._8_4_ = 0x800000;
                  auVar120._0_8_ = 0x80000000800000;
                  auVar120._12_4_ = 0x800000;
                  auVar117 = vmaxps_avx512vl(auVar117,auVar120);
                  auVar119 = vpsrld_avx(auVar117,0x17);
                  auVar305._8_4_ = 0x807fffff;
                  auVar305._0_8_ = 0x807fffff807fffff;
                  auVar305._12_4_ = 0x807fffff;
                  auVar121._8_4_ = 0x3f000000;
                  auVar121._0_8_ = 0x3f0000003f000000;
                  auVar121._12_4_ = 0x3f000000;
                  auVar117 = vpternlogd_avx512vl(auVar117,auVar305,auVar121,0xea);
                  auVar18._8_4_ = 0x3f3504f3;
                  auVar18._0_8_ = 0x3f3504f33f3504f3;
                  auVar18._12_4_ = 0x3f3504f3;
                  uVar12 = vcmpps_avx512vl(auVar117,auVar18,1);
                  auVar19._8_4_ = 0xbf800000;
                  auVar19._0_8_ = 0xbf800000bf800000;
                  auVar19._12_4_ = 0xbf800000;
                  auVar118 = vaddps_avx512vl(auVar117,auVar19);
                  auVar117 = vaddps_avx512vl(auVar118,auVar117);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar124._0_4_ =
                       (float)((uint)bVar105 * auVar117._0_4_ | (uint)!bVar105 * auVar118._0_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar124._4_4_ =
                       (float)((uint)bVar105 * auVar117._4_4_ | (uint)!bVar105 * auVar118._4_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar124._8_4_ =
                       (float)((uint)bVar105 * auVar117._8_4_ | (uint)!bVar105 * auVar118._8_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar124._12_4_ =
                       (float)((uint)bVar105 * auVar117._12_4_ | (uint)!bVar105 * auVar118._12_4_);
                  auVar224._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                  auVar224._4_4_ = auVar124._4_4_ * auVar124._4_4_;
                  auVar224._8_4_ = auVar124._8_4_ * auVar124._8_4_;
                  auVar224._12_4_ = auVar124._12_4_ * auVar124._12_4_;
                  auVar20._8_4_ = 0xbdebd1b8;
                  auVar20._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar20._12_4_ = 0xbdebd1b8;
                  auVar117 = vfmadd213ps_avx512vl(auVar108,auVar124,auVar20);
                  auVar117 = vfmadd213ps_avx512vl(auVar117,auVar124,auVar109);
                  auVar117 = vfmadd213ps_avx512vl(auVar117,auVar124,auVar110);
                  auVar117 = vfmadd213ps_avx512vl(auVar117,auVar124,auVar111);
                  auVar117 = vfmadd213ps_avx512vl(auVar117,auVar124,auVar112);
                  auVar117 = vfmadd213ps_avx512vl(auVar117,auVar124,auVar113);
                  auVar117 = vfmadd213ps_avx512vl(auVar117,auVar124,auVar114);
                  auVar117 = vfmadd213ps_avx512vl(auVar117,auVar124,auVar115);
                  auVar118 = vmulps_avx512vl(auVar224,auVar124);
                  auVar118 = vmulps_avx512vl(auVar118,auVar117);
                  auVar21._8_4_ = 0xffffff82;
                  auVar21._0_8_ = 0xffffff82ffffff82;
                  auVar21._12_4_ = 0xffffff82;
                  auVar117 = vpaddd_avx512vl(auVar119,auVar21);
                  auVar117 = vcvtdq2ps_avx(auVar117);
                  auVar119 = vsubps_avx512vl(auVar117,auVar137);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar125._0_4_ = (uint)bVar105 * auVar119._0_4_ | (uint)!bVar105 * auVar117._0_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar125._4_4_ = (uint)bVar105 * auVar119._4_4_ | (uint)!bVar105 * auVar117._4_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar125._8_4_ = (uint)bVar105 * auVar119._8_4_ | (uint)!bVar105 * auVar117._8_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar125._12_4_ =
                       (uint)bVar105 * auVar119._12_4_ | (uint)!bVar105 * auVar117._12_4_;
                  auVar117 = vfmadd231ps_avx512vl(auVar118,auVar125,auVar297);
                  auVar117 = vfmsub231ps_avx512vl(auVar117,auVar131,auVar224);
                  auVar117 = vsubps_avx512vl(auVar117,auVar124);
                  auVar117 = vfnmadd231ps_fma(auVar117,auVar136,auVar125);
                  auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar126._0_4_ =
                       (uint)bVar105 * auVar118._0_4_ |
                       (uint)!bVar105 * (int)(auVar117._0_4_ + auVar117._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar126._4_4_ =
                       (uint)bVar105 * auVar118._4_4_ |
                       (uint)!bVar105 * (int)(auVar117._4_4_ + auVar117._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar126._8_4_ =
                       (uint)bVar105 * auVar118._8_4_ |
                       (uint)!bVar105 * (int)(auVar117._8_4_ + auVar117._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar126._12_4_ =
                       (uint)bVar105 * auVar118._12_4_ |
                       (uint)!bVar105 * (int)(auVar117._12_4_ + auVar117._12_4_);
                  auVar117 = vminps_avx(auVar126,auVar129);
                  auVar118 = vmaxps_avx(auVar117,auVar130);
                  auVar119 = vfmadd213ps_fma(auVar132,auVar118,auVar131);
                  auVar306._0_4_ = (int)auVar119._0_4_;
                  auVar306._4_4_ = (int)auVar119._4_4_;
                  auVar306._8_4_ = (int)auVar119._8_4_;
                  auVar306._12_4_ = (int)auVar119._12_4_;
                  auVar117 = vcvtdq2ps_avx(auVar306);
                  uVar97 = vcmpps_avx512vl(auVar119,auVar117,1);
                  auVar119 = vsubps_avx512vl(auVar117,auVar137);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar127._0_4_ =
                       (float)((uint)bVar105 * auVar119._0_4_ | (uint)!bVar105 * auVar117._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar127._4_4_ =
                       (float)((uint)bVar105 * auVar119._4_4_ | (uint)!bVar105 * auVar117._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar127._8_4_ =
                       (float)((uint)bVar105 * auVar119._8_4_ | (uint)!bVar105 * auVar117._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar127._12_4_ =
                       (float)((uint)bVar105 * auVar119._12_4_ | (uint)!bVar105 * auVar117._12_4_);
                  auVar117 = vfmsub231ps_fma(auVar118,auVar127,auVar136);
                  auVar117 = vfnmsub231ps_fma(auVar117,auVar127,auVar297);
                  auVar253._0_4_ = auVar117._0_4_ * auVar117._0_4_;
                  auVar253._4_4_ = auVar117._4_4_ * auVar117._4_4_;
                  auVar253._8_4_ = auVar117._8_4_ * auVar117._8_4_;
                  auVar253._12_4_ = auVar117._12_4_ * auVar117._12_4_;
                  auVar118 = vfmadd213ps_avx512vl(auVar107,auVar117,auVar134);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar273);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar279);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar285);
                  auVar118 = vfmadd213ps_avx512vl(auVar118,auVar117,auVar131);
                  auVar117 = vfmadd213ps_avx512vl(auVar118,auVar253,auVar117);
                  auVar118 = vaddps_avx512vl(auVar117,auVar137);
                  auVar225._0_4_ = (int)auVar127._0_4_;
                  auVar225._4_4_ = (int)auVar127._4_4_;
                  auVar225._8_4_ = (int)auVar127._8_4_;
                  auVar225._12_4_ = (int)auVar127._12_4_;
                  auVar117 = vpslld_avx(auVar225,0x17);
                  auVar117 = vpaddd_avx(auVar291,auVar117);
                  auVar118 = vfmadd213ps_fma(auVar117,auVar118,auVar137);
                  auVar117 = vrcpps_avx(auVar118);
                  auVar307._0_4_ = auVar117._0_4_ + auVar117._0_4_;
                  auVar307._4_4_ = auVar117._4_4_ + auVar117._4_4_;
                  auVar307._8_4_ = auVar117._8_4_ + auVar117._8_4_;
                  auVar307._12_4_ = auVar117._12_4_ + auVar117._12_4_;
                  auVar118 = vfmsub213ps_avx512vl(auVar118,auVar307,auVar116);
                  auVar117 = vfnmadd213ps_fma(auVar118,auVar117,auVar307);
                  auVar117 = vfmsub213ps_fma(auVar117,auVar122,auVar122);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar119._4_4_ = uVar1;
                  auVar119._0_4_ = uVar1;
                  auVar119._8_4_ = uVar1;
                  auVar119._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar118._4_4_ = uVar1;
                  auVar118._0_4_ = uVar1;
                  auVar118._8_4_ = uVar1;
                  auVar118._12_4_ = uVar1;
                  auVar122 = vfmadd213ps_avx512vl(auVar119,auVar122,auVar118);
                  auVar122 = vmaxps_avx512vl(auVar122,auVar106);
                  auVar122 = vminps_avx(auVar122,auVar137);
                  auVar117._0_4_ = auVar122._0_4_ * auVar198._0_4_;
                  auVar117._4_4_ = auVar122._4_4_ * auVar198._4_4_;
                  auVar117._8_4_ = auVar122._8_4_ * auVar198._8_4_;
                  auVar117._12_4_ = auVar122._12_4_ * auVar198._12_4_;
                }
                auVar122 = auVar117;
              }
              *pauVar93 = auVar122;
              pauVar93 = pauVar93 + 1;
            }
          }
        }
        if ((iVar3 == 4) && (_elempack == 4)) {
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = (void *)0x0;
          if (0 < iVar99) {
            pvVar86 = pvVar84;
          }
          auVar199._8_4_ = 0x42b0c0a5;
          auVar199._0_8_ = 0x42b0c0a542b0c0a5;
          auVar199._12_4_ = 0x42b0c0a5;
          auVar203._8_4_ = 0xc2b0c0a5;
          auVar203._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar203._12_4_ = 0xc2b0c0a5;
          auVar208._8_4_ = 0x3f000000;
          auVar208._0_8_ = 0x3f0000003f000000;
          auVar208._12_4_ = 0x3f000000;
          auVar212._8_4_ = 0x3fb8aa3b;
          auVar212._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar212._12_4_ = 0x3fb8aa3b;
          auVar216._8_4_ = 0x3f800000;
          auVar216._0_8_ = 0x3f8000003f800000;
          auVar216._12_4_ = 0x3f800000;
          auVar220._8_4_ = 0x3f318000;
          auVar220._0_8_ = 0x3f3180003f318000;
          auVar220._12_4_ = 0x3f318000;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar269._8_4_ = 0x3ab743ce;
          auVar269._0_8_ = 0x3ab743ce3ab743ce;
          auVar269._12_4_ = 0x3ab743ce;
          auVar274._8_4_ = 0x3c088908;
          auVar274._0_8_ = 0x3c0889083c088908;
          auVar274._12_4_ = 0x3c088908;
          auVar280._8_4_ = 0x3d2aa9c1;
          auVar280._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar280._12_4_ = 0x3d2aa9c1;
          auVar286._8_4_ = 0x3e2aaaaa;
          auVar286._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar286._12_4_ = 0x3e2aaaaa;
          auVar292._8_4_ = 0x3f800000;
          auVar292._0_8_ = 0x3f8000003f800000;
          auVar292._12_4_ = 0x3f800000;
          auVar298._8_4_ = 0xb95e8083;
          auVar298._0_8_ = 0xb95e8083b95e8083;
          auVar298._12_4_ = 0xb95e8083;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar129 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar106 = vxorps_avx512vl(auVar106,auVar106);
          auVar131 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          for (pvVar90 = (void *)0x0; pvVar90 != pvVar86; pvVar90 = (void *)((long)pvVar90 + 1)) {
            pauVar93 = (undefined1 (*) [16])
                       ((long)top_blob->w * (long)pvVar90 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            for (iVar94 = 0; iVar94 <= iVar101; iVar94 = iVar94 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar132 = ZEXT816(0) << 0x40;
              }
              else {
                auVar132 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var5) + (long)pvVar90 * 0x10);
              }
              auVar198 = ZEXT1664(auVar132);
              pauVar104 = (undefined1 (*) [16])
                          ((this->weight_data_packed).cstep * (long)pvVar90 *
                           (this->weight_data_packed).elemsize +
                          (long)(this->weight_data_packed).data);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                puVar95 = (undefined4 *)
                          ((long)local_d8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar94 * 4) * 4 +
                          (long)local_d8.w *
                          CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97);
                iVar91 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                  iVar91 = 0;
                }
                while (bVar105 = iVar91 != 0, iVar91 = iVar91 + -1, bVar105) {
                  uVar1 = *puVar95;
                  auVar14._4_4_ = uVar1;
                  auVar14._0_4_ = uVar1;
                  auVar14._8_4_ = uVar1;
                  auVar14._12_4_ = uVar1;
                  auVar132 = vfmadd231ps_avx512vl(auVar198._0_16_,*pauVar104,auVar14);
                  uVar1 = puVar95[1];
                  auVar15._4_4_ = uVar1;
                  auVar15._0_4_ = uVar1;
                  auVar15._8_4_ = uVar1;
                  auVar15._12_4_ = uVar1;
                  auVar132 = vfmadd231ps_avx512vl(auVar132,pauVar104[1],auVar15);
                  uVar1 = puVar95[2];
                  auVar16._4_4_ = uVar1;
                  auVar16._0_4_ = uVar1;
                  auVar16._8_4_ = uVar1;
                  auVar16._12_4_ = uVar1;
                  auVar132 = vfmadd231ps_avx512vl(auVar132,pauVar104[2],auVar16);
                  uVar1 = puVar95[3];
                  auVar17._4_4_ = uVar1;
                  auVar17._0_4_ = uVar1;
                  auVar17._8_4_ = uVar1;
                  auVar17._12_4_ = uVar1;
                  auVar132 = vfmadd231ps_avx512vl(auVar132,pauVar104[3],auVar17);
                  auVar198 = ZEXT1664(auVar132);
                  puVar95 = puVar95 + (long)*(int *)(&this->field_0xd8 + (long)p_Var7) * 4;
                  pauVar104 = pauVar104 + 4;
                }
              }
              auVar132 = auVar198._0_16_;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                auVar133 = vmaxps_avx512vl(auVar132,auVar106);
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 2:
                  auVar132 = vminps_avx512vl(auVar132,auVar106);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar35._4_4_ = uVar1;
                  auVar35._0_4_ = uVar1;
                  auVar35._8_4_ = uVar1;
                  auVar35._12_4_ = uVar1;
                  auVar133 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar35);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar132 = vmaxps_avx512vl(auVar132,auVar33);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar133 = vminps_avx512vl(auVar132,auVar34);
                  break;
                case 4:
                  auVar31._8_4_ = 0x80000000;
                  auVar31._0_8_ = 0x8000000080000000;
                  auVar31._12_4_ = 0x80000000;
                  auVar132 = vxorps_avx512vl(auVar132,auVar31);
                  auVar132 = vminps_avx(auVar132,auVar199);
                  auVar137 = vmaxps_avx(auVar132,auVar203);
                  auVar136 = vfmadd231ps_fma(auVar208,auVar137,auVar212);
                  auVar313._0_4_ = (int)auVar136._0_4_;
                  auVar313._4_4_ = (int)auVar136._4_4_;
                  auVar313._8_4_ = (int)auVar136._8_4_;
                  auVar313._12_4_ = (int)auVar136._12_4_;
                  auVar132 = vcvtdq2ps_avx(auVar313);
                  uVar97 = vcmpps_avx512vl(auVar136,auVar132,1);
                  auVar136 = vsubps_avx512vl(auVar132,auVar216);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar142._0_4_ =
                       (float)((uint)bVar105 * auVar136._0_4_ | (uint)!bVar105 * auVar132._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar142._4_4_ =
                       (float)((uint)bVar105 * auVar136._4_4_ | (uint)!bVar105 * auVar132._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar142._8_4_ =
                       (float)((uint)bVar105 * auVar136._8_4_ | (uint)!bVar105 * auVar132._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar142._12_4_ =
                       (float)((uint)bVar105 * auVar136._12_4_ | (uint)!bVar105 * auVar132._12_4_);
                  auVar132 = vfmsub231ps_fma(auVar137,auVar142,auVar220);
                  auVar32._8_4_ = 0x395e8083;
                  auVar32._0_8_ = 0x395e8083395e8083;
                  auVar32._12_4_ = 0x395e8083;
                  auVar137 = vfmsub231ps_avx512vl(auVar132,auVar142,auVar32);
                  auVar230._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                  auVar230._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                  auVar230._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                  auVar230._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                  auVar132 = vfmadd213ps_fma(auVar107,auVar137,auVar269);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar274);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar280);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar286);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar208);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar230,auVar137);
                  auVar193._0_4_ = auVar132._0_4_ + 1.0;
                  auVar193._4_4_ = auVar132._4_4_ + 1.0;
                  auVar193._8_4_ = auVar132._8_4_ + 1.0;
                  auVar193._12_4_ = auVar132._12_4_ + 1.0;
                  auVar231._0_4_ = (int)auVar142._0_4_;
                  auVar231._4_4_ = (int)auVar142._4_4_;
                  auVar231._8_4_ = (int)auVar142._8_4_;
                  auVar231._12_4_ = (int)auVar142._12_4_;
                  auVar132 = vpslld_avx(auVar231,0x17);
                  auVar132 = vpaddd_avx(auVar292,auVar132);
                  auVar137 = vfmadd213ps_fma(auVar132,auVar193,auVar216);
                  auVar132 = vrcpps_avx(auVar137);
                  auVar137 = vfmsub213ps_fma(auVar137,auVar132,auVar216);
                  auVar133 = vfnmadd132ps_fma(auVar137,auVar132,auVar132);
                  break;
                case 5:
                  auVar137 = vminps_avx(auVar132,auVar199);
                  auVar136 = vmaxps_avx(auVar137,auVar203);
                  auVar134 = vfmadd213ps_fma(auVar212,auVar136,auVar208);
                  auVar309._0_4_ = (int)auVar134._0_4_;
                  auVar309._4_4_ = (int)auVar134._4_4_;
                  auVar309._8_4_ = (int)auVar134._8_4_;
                  auVar309._12_4_ = (int)auVar134._12_4_;
                  auVar137 = vcvtdq2ps_avx(auVar309);
                  uVar97 = vcmpps_avx512vl(auVar134,auVar137,1);
                  auVar134 = vsubps_avx512vl(auVar137,auVar216);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar135._0_4_ =
                       (float)((uint)bVar105 * auVar134._0_4_ | (uint)!bVar105 * auVar137._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar135._4_4_ =
                       (float)((uint)bVar105 * auVar134._4_4_ | (uint)!bVar105 * auVar137._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar135._8_4_ =
                       (float)((uint)bVar105 * auVar134._8_4_ | (uint)!bVar105 * auVar137._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar135._12_4_ =
                       (float)((uint)bVar105 * auVar134._12_4_ | (uint)!bVar105 * auVar137._12_4_);
                  auVar137 = vfmsub231ps_fma(auVar136,auVar135,auVar220);
                  auVar137 = vfnmsub231ps_fma(auVar137,auVar135,auVar298);
                  auVar254._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                  auVar254._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                  auVar254._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                  auVar254._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                  auVar136 = vfmadd213ps_avx512vl(auVar107,auVar137,auVar269);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar274);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar280);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar286);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar208);
                  auVar137 = vfmadd213ps_avx512vl(auVar136,auVar254,auVar137);
                  auVar136 = vaddps_avx512vl(auVar137,auVar216);
                  auVar255._0_4_ = (int)auVar135._0_4_;
                  auVar255._4_4_ = (int)auVar135._4_4_;
                  auVar255._8_4_ = (int)auVar135._8_4_;
                  auVar255._12_4_ = (int)auVar135._12_4_;
                  auVar137 = vpslld_avx(auVar255,0x17);
                  auVar137 = vpaddd_avx(auVar137,auVar292);
                  auVar137 = vfmadd213ps_fma(auVar137,auVar136,auVar216);
                  uVar97 = vcmpps_avx512vl(auVar137,auVar106,2);
                  auVar28._8_4_ = 0x800000;
                  auVar28._0_8_ = 0x80000000800000;
                  auVar28._12_4_ = 0x800000;
                  auVar137 = vmaxps_avx512vl(auVar137,auVar28);
                  auVar134 = vpsrld_avx(auVar137,0x17);
                  auVar310._8_4_ = 0x807fffff;
                  auVar310._0_8_ = 0x807fffff807fffff;
                  auVar310._12_4_ = 0x807fffff;
                  auVar29._8_4_ = 0x3f000000;
                  auVar29._0_8_ = 0x3f0000003f000000;
                  auVar29._12_4_ = 0x3f000000;
                  auVar137 = vpternlogd_avx512vl(auVar137,auVar310,auVar29,0xea);
                  uVar12 = vcmpps_avx512vl(auVar137,auVar108,1);
                  auVar136 = vaddps_avx512vl(auVar137,auVar109);
                  auVar137 = vaddps_avx512vl(auVar136,auVar137);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar138._0_4_ =
                       (float)((uint)bVar105 * auVar137._0_4_ | (uint)!bVar105 * auVar136._0_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar138._4_4_ =
                       (float)((uint)bVar105 * auVar137._4_4_ | (uint)!bVar105 * auVar136._4_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar138._8_4_ =
                       (float)((uint)bVar105 * auVar137._8_4_ | (uint)!bVar105 * auVar136._8_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar138._12_4_ =
                       (float)((uint)bVar105 * auVar137._12_4_ | (uint)!bVar105 * auVar136._12_4_);
                  auVar228._0_4_ = auVar138._0_4_ * auVar138._0_4_;
                  auVar228._4_4_ = auVar138._4_4_ * auVar138._4_4_;
                  auVar228._8_4_ = auVar138._8_4_ * auVar138._8_4_;
                  auVar228._12_4_ = auVar138._12_4_ * auVar138._12_4_;
                  auVar137 = vfmadd213ps_avx512vl(auVar110,auVar138,auVar111);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar138,auVar112);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar138,auVar113);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar138,auVar114);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar138,auVar115);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar138,auVar116);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar138,auVar129);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar138,auVar130);
                  auVar136 = vmulps_avx512vl(auVar228,auVar138);
                  auVar136 = vmulps_avx512vl(auVar136,auVar137);
                  auVar30._8_4_ = 0xffffff82;
                  auVar30._0_8_ = 0xffffff82ffffff82;
                  auVar30._12_4_ = 0xffffff82;
                  auVar137 = vpaddd_avx512vl(auVar134,auVar30);
                  auVar137 = vcvtdq2ps_avx(auVar137);
                  auVar134 = vsubps_avx512vl(auVar137,auVar216);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar139._0_4_ = (uint)bVar105 * auVar134._0_4_ | (uint)!bVar105 * auVar137._0_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar139._4_4_ = (uint)bVar105 * auVar134._4_4_ | (uint)!bVar105 * auVar137._4_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar139._8_4_ = (uint)bVar105 * auVar134._8_4_ | (uint)!bVar105 * auVar137._8_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar139._12_4_ =
                       (uint)bVar105 * auVar134._12_4_ | (uint)!bVar105 * auVar137._12_4_;
                  auVar137 = vfmadd231ps_avx512vl(auVar136,auVar139,auVar298);
                  auVar137 = vfmsub231ps_avx512vl(auVar137,auVar208,auVar228);
                  auVar137 = vsubps_avx512vl(auVar137,auVar138);
                  auVar137 = vfnmadd231ps_fma(auVar137,auVar220,auVar139);
                  auVar136 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar140._0_4_ =
                       (uint)bVar105 * auVar136._0_4_ |
                       (uint)!bVar105 * (int)(auVar137._0_4_ + auVar137._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar140._4_4_ =
                       (uint)bVar105 * auVar136._4_4_ |
                       (uint)!bVar105 * (int)(auVar137._4_4_ + auVar137._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar140._8_4_ =
                       (uint)bVar105 * auVar136._8_4_ |
                       (uint)!bVar105 * (int)(auVar137._8_4_ + auVar137._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar140._12_4_ =
                       (uint)bVar105 * auVar136._12_4_ |
                       (uint)!bVar105 * (int)(auVar137._12_4_ + auVar137._12_4_);
                  auVar137 = vminps_avx(auVar140,auVar199);
                  auVar136 = vmaxps_avx(auVar137,auVar203);
                  auVar134 = vfmadd213ps_fma(auVar212,auVar136,auVar208);
                  auVar311._0_4_ = (int)auVar134._0_4_;
                  auVar311._4_4_ = (int)auVar134._4_4_;
                  auVar311._8_4_ = (int)auVar134._8_4_;
                  auVar311._12_4_ = (int)auVar134._12_4_;
                  auVar137 = vcvtdq2ps_avx(auVar311);
                  uVar97 = vcmpps_avx512vl(auVar134,auVar137,1);
                  auVar134 = vsubps_avx512vl(auVar137,auVar216);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar141._0_4_ =
                       (float)((uint)bVar105 * auVar134._0_4_ | (uint)!bVar105 * auVar137._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar141._4_4_ =
                       (float)((uint)bVar105 * auVar134._4_4_ | (uint)!bVar105 * auVar137._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar141._8_4_ =
                       (float)((uint)bVar105 * auVar134._8_4_ | (uint)!bVar105 * auVar137._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar141._12_4_ =
                       (float)((uint)bVar105 * auVar134._12_4_ | (uint)!bVar105 * auVar137._12_4_);
                  auVar137 = vfmsub231ps_fma(auVar136,auVar141,auVar220);
                  auVar137 = vfnmsub231ps_fma(auVar137,auVar141,auVar298);
                  auVar256._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                  auVar256._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                  auVar256._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                  auVar256._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                  auVar136 = vfmadd213ps_avx512vl(auVar107,auVar137,auVar269);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar274);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar280);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar286);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar208);
                  auVar137 = vfmadd213ps_avx512vl(auVar136,auVar256,auVar137);
                  auVar136 = vaddps_avx512vl(auVar137,auVar216);
                  auVar229._0_4_ = (int)auVar141._0_4_;
                  auVar229._4_4_ = (int)auVar141._4_4_;
                  auVar229._8_4_ = (int)auVar141._8_4_;
                  auVar229._12_4_ = (int)auVar141._12_4_;
                  auVar137 = vpslld_avx(auVar229,0x17);
                  auVar137 = vpaddd_avx(auVar292,auVar137);
                  auVar136 = vfmadd213ps_fma(auVar137,auVar136,auVar216);
                  auVar137 = vrcpps_avx(auVar136);
                  auVar312._0_4_ = auVar137._0_4_ + auVar137._0_4_;
                  auVar312._4_4_ = auVar137._4_4_ + auVar137._4_4_;
                  auVar312._8_4_ = auVar137._8_4_ + auVar137._8_4_;
                  auVar312._12_4_ = auVar137._12_4_ + auVar137._12_4_;
                  auVar136 = vfmsub213ps_avx512vl(auVar136,auVar312,auVar131);
                  auVar137 = vfnmadd213ps_fma(auVar136,auVar137,auVar312);
                  auVar133 = vfmsub213ps_fma(auVar137,auVar132,auVar132);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar232._4_4_ = uVar1;
                  auVar232._0_4_ = uVar1;
                  auVar232._8_4_ = uVar1;
                  auVar232._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar27._4_4_ = uVar1;
                  auVar27._0_4_ = uVar1;
                  auVar27._8_4_ = uVar1;
                  auVar27._12_4_ = uVar1;
                  auVar132 = vfmadd213ps_avx512vl(auVar232,auVar132,auVar27);
                  auVar132 = vmaxps_avx512vl(auVar132,auVar106);
                  auVar132 = vminps_avx(auVar132,auVar216);
                  auVar133._0_4_ = auVar132._0_4_ * auVar198._0_4_;
                  auVar133._4_4_ = auVar132._4_4_ * auVar198._4_4_;
                  auVar133._8_4_ = auVar132._8_4_ * auVar198._8_4_;
                  auVar133._12_4_ = auVar132._12_4_ * auVar198._12_4_;
                }
                auVar132 = auVar133;
              }
              *pauVar93 = auVar132;
              pauVar93 = pauVar93 + 1;
            }
          }
        }
        if ((iVar3 == 1) && (_elempack == 4)) {
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = (void *)0x0;
          if (0 < iVar99) {
            pvVar86 = pvVar84;
          }
          auVar200._8_4_ = 0x42b0c0a5;
          auVar200._0_8_ = 0x42b0c0a542b0c0a5;
          auVar200._12_4_ = 0x42b0c0a5;
          auVar204._8_4_ = 0xc2b0c0a5;
          auVar204._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar204._12_4_ = 0xc2b0c0a5;
          auVar209._8_4_ = 0x3f000000;
          auVar209._0_8_ = 0x3f0000003f000000;
          auVar209._12_4_ = 0x3f000000;
          auVar213._8_4_ = 0x3fb8aa3b;
          auVar213._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar213._12_4_ = 0x3fb8aa3b;
          auVar217._8_4_ = 0x3f800000;
          auVar217._0_8_ = 0x3f8000003f800000;
          auVar217._12_4_ = 0x3f800000;
          auVar221._8_4_ = 0x3f318000;
          auVar221._0_8_ = 0x3f3180003f318000;
          auVar221._12_4_ = 0x3f318000;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar270._8_4_ = 0x3ab743ce;
          auVar270._0_8_ = 0x3ab743ce3ab743ce;
          auVar270._12_4_ = 0x3ab743ce;
          auVar275._8_4_ = 0x3c088908;
          auVar275._0_8_ = 0x3c0889083c088908;
          auVar275._12_4_ = 0x3c088908;
          auVar281._8_4_ = 0x3d2aa9c1;
          auVar281._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar281._12_4_ = 0x3d2aa9c1;
          auVar287._8_4_ = 0x3e2aaaaa;
          auVar287._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar287._12_4_ = 0x3e2aaaaa;
          auVar293._8_4_ = 0x3f800000;
          auVar293._0_8_ = 0x3f8000003f800000;
          auVar293._12_4_ = 0x3f800000;
          auVar299._8_4_ = 0xb95e8083;
          auVar299._0_8_ = 0xb95e8083b95e8083;
          auVar299._12_4_ = 0xb95e8083;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar129 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar106 = vxorps_avx512vl(auVar106,auVar106);
          auVar131 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          for (pvVar90 = (void *)0x0; pvVar90 != pvVar86; pvVar90 = (void *)((long)pvVar90 + 1)) {
            pauVar93 = (undefined1 (*) [16])
                       ((long)top_blob->w * (long)pvVar90 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            for (iVar94 = 0; iVar94 <= iVar101; iVar94 = iVar94 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar132 = ZEXT816(0) << 0x40;
              }
              else {
                auVar132 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var5) + (long)pvVar90 * 0x10);
              }
              auVar198 = ZEXT1664(auVar132);
              pauVar104 = (undefined1 (*) [16])
                          ((this->weight_data_packed).cstep * (long)pvVar90 *
                           (this->weight_data_packed).elemsize +
                          (long)(this->weight_data_packed).data);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                puVar95 = (undefined4 *)
                          ((long)local_d8.data +
                          (long)*(int *)(&this->field_0xdc + (long)p_Var7) * (long)iVar94 * 4 +
                          (long)local_d8.w *
                          CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97);
                iVar91 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (iVar91 < 1) {
                  iVar91 = 0;
                }
                while (bVar105 = iVar91 != 0, iVar91 = iVar91 + -1, bVar105) {
                  uVar1 = *puVar95;
                  auVar233._4_4_ = uVar1;
                  auVar233._0_4_ = uVar1;
                  auVar233._8_4_ = uVar1;
                  auVar233._12_4_ = uVar1;
                  auVar132 = vfmadd231ps_fma(auVar198._0_16_,auVar233,*pauVar104);
                  auVar198 = ZEXT1664(auVar132);
                  puVar95 = puVar95 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                  pauVar104 = pauVar104 + 1;
                }
              }
              auVar132 = auVar198._0_16_;
              if (*(int *)(&this->field_0xf4 + (long)p_Var5) - 1U < 6) {
                auVar143 = vmaxps_avx512vl(auVar132,auVar106);
                switch(*(int *)(&this->field_0xf4 + (long)p_Var5)) {
                case 2:
                  auVar132 = vminps_avx512vl(auVar132,auVar106);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar44._4_4_ = uVar1;
                  auVar44._0_4_ = uVar1;
                  auVar44._8_4_ = uVar1;
                  auVar44._12_4_ = uVar1;
                  auVar143 = vfmadd231ps_avx512vl(auVar143,auVar132,auVar44);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar132 = vmaxps_avx512vl(auVar132,auVar42);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar43._4_4_ = uVar1;
                  auVar43._0_4_ = uVar1;
                  auVar43._8_4_ = uVar1;
                  auVar43._12_4_ = uVar1;
                  auVar143 = vminps_avx512vl(auVar132,auVar43);
                  break;
                case 4:
                  auVar40._8_4_ = 0x80000000;
                  auVar40._0_8_ = 0x8000000080000000;
                  auVar40._12_4_ = 0x80000000;
                  auVar132 = vxorps_avx512vl(auVar132,auVar40);
                  auVar132 = vminps_avx(auVar132,auVar200);
                  auVar137 = vmaxps_avx(auVar132,auVar204);
                  auVar136 = vfmadd231ps_fma(auVar209,auVar137,auVar213);
                  auVar318._0_4_ = (int)auVar136._0_4_;
                  auVar318._4_4_ = (int)auVar136._4_4_;
                  auVar318._8_4_ = (int)auVar136._8_4_;
                  auVar318._12_4_ = (int)auVar136._12_4_;
                  auVar132 = vcvtdq2ps_avx(auVar318);
                  uVar97 = vcmpps_avx512vl(auVar136,auVar132,1);
                  auVar136 = vsubps_avx512vl(auVar132,auVar217);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar149._0_4_ =
                       (float)((uint)bVar105 * auVar136._0_4_ | (uint)!bVar105 * auVar132._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar149._4_4_ =
                       (float)((uint)bVar105 * auVar136._4_4_ | (uint)!bVar105 * auVar132._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar149._8_4_ =
                       (float)((uint)bVar105 * auVar136._8_4_ | (uint)!bVar105 * auVar132._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar149._12_4_ =
                       (float)((uint)bVar105 * auVar136._12_4_ | (uint)!bVar105 * auVar132._12_4_);
                  auVar132 = vfmsub231ps_fma(auVar137,auVar149,auVar221);
                  auVar41._8_4_ = 0x395e8083;
                  auVar41._0_8_ = 0x395e8083395e8083;
                  auVar41._12_4_ = 0x395e8083;
                  auVar137 = vfmsub231ps_avx512vl(auVar132,auVar149,auVar41);
                  auVar236._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                  auVar236._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                  auVar236._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                  auVar236._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                  auVar132 = vfmadd213ps_fma(auVar107,auVar137,auVar270);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar275);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar281);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar287);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar137,auVar209);
                  auVar132 = vfmadd213ps_fma(auVar132,auVar236,auVar137);
                  auVar194._0_4_ = auVar132._0_4_ + 1.0;
                  auVar194._4_4_ = auVar132._4_4_ + 1.0;
                  auVar194._8_4_ = auVar132._8_4_ + 1.0;
                  auVar194._12_4_ = auVar132._12_4_ + 1.0;
                  auVar237._0_4_ = (int)auVar149._0_4_;
                  auVar237._4_4_ = (int)auVar149._4_4_;
                  auVar237._8_4_ = (int)auVar149._8_4_;
                  auVar237._12_4_ = (int)auVar149._12_4_;
                  auVar132 = vpslld_avx(auVar237,0x17);
                  auVar132 = vpaddd_avx(auVar293,auVar132);
                  auVar137 = vfmadd213ps_fma(auVar132,auVar194,auVar217);
                  auVar132 = vrcpps_avx(auVar137);
                  auVar137 = vfmsub213ps_fma(auVar137,auVar132,auVar217);
                  auVar143 = vfnmadd132ps_fma(auVar137,auVar132,auVar132);
                  break;
                case 5:
                  auVar137 = vminps_avx(auVar132,auVar200);
                  auVar136 = vmaxps_avx(auVar137,auVar204);
                  auVar134 = vfmadd213ps_fma(auVar213,auVar136,auVar209);
                  auVar314._0_4_ = (int)auVar134._0_4_;
                  auVar314._4_4_ = (int)auVar134._4_4_;
                  auVar314._8_4_ = (int)auVar134._8_4_;
                  auVar314._12_4_ = (int)auVar134._12_4_;
                  auVar137 = vcvtdq2ps_avx(auVar314);
                  uVar97 = vcmpps_avx512vl(auVar134,auVar137,1);
                  auVar134 = vsubps_avx512vl(auVar137,auVar217);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar144._0_4_ =
                       (float)((uint)bVar105 * auVar134._0_4_ | (uint)!bVar105 * auVar137._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar144._4_4_ =
                       (float)((uint)bVar105 * auVar134._4_4_ | (uint)!bVar105 * auVar137._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar144._8_4_ =
                       (float)((uint)bVar105 * auVar134._8_4_ | (uint)!bVar105 * auVar137._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar144._12_4_ =
                       (float)((uint)bVar105 * auVar134._12_4_ | (uint)!bVar105 * auVar137._12_4_);
                  auVar137 = vfmsub231ps_fma(auVar136,auVar144,auVar221);
                  auVar137 = vfnmsub231ps_fma(auVar137,auVar144,auVar299);
                  auVar257._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                  auVar257._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                  auVar257._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                  auVar257._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                  auVar136 = vfmadd213ps_avx512vl(auVar107,auVar137,auVar270);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar275);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar281);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar287);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar209);
                  auVar137 = vfmadd213ps_avx512vl(auVar136,auVar257,auVar137);
                  auVar136 = vaddps_avx512vl(auVar137,auVar217);
                  auVar258._0_4_ = (int)auVar144._0_4_;
                  auVar258._4_4_ = (int)auVar144._4_4_;
                  auVar258._8_4_ = (int)auVar144._8_4_;
                  auVar258._12_4_ = (int)auVar144._12_4_;
                  auVar137 = vpslld_avx(auVar258,0x17);
                  auVar137 = vpaddd_avx(auVar137,auVar293);
                  auVar137 = vfmadd213ps_fma(auVar137,auVar136,auVar217);
                  uVar97 = vcmpps_avx512vl(auVar137,auVar106,2);
                  auVar37._8_4_ = 0x800000;
                  auVar37._0_8_ = 0x80000000800000;
                  auVar37._12_4_ = 0x800000;
                  auVar137 = vmaxps_avx512vl(auVar137,auVar37);
                  auVar134 = vpsrld_avx(auVar137,0x17);
                  auVar315._8_4_ = 0x807fffff;
                  auVar315._0_8_ = 0x807fffff807fffff;
                  auVar315._12_4_ = 0x807fffff;
                  auVar38._8_4_ = 0x3f000000;
                  auVar38._0_8_ = 0x3f0000003f000000;
                  auVar38._12_4_ = 0x3f000000;
                  auVar137 = vpternlogd_avx512vl(auVar137,auVar315,auVar38,0xea);
                  uVar12 = vcmpps_avx512vl(auVar137,auVar108,1);
                  auVar136 = vaddps_avx512vl(auVar137,auVar109);
                  auVar137 = vaddps_avx512vl(auVar136,auVar137);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar145._0_4_ =
                       (float)((uint)bVar105 * auVar137._0_4_ | (uint)!bVar105 * auVar136._0_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar145._4_4_ =
                       (float)((uint)bVar105 * auVar137._4_4_ | (uint)!bVar105 * auVar136._4_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar145._8_4_ =
                       (float)((uint)bVar105 * auVar137._8_4_ | (uint)!bVar105 * auVar136._8_4_);
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar145._12_4_ =
                       (float)((uint)bVar105 * auVar137._12_4_ | (uint)!bVar105 * auVar136._12_4_);
                  auVar234._0_4_ = auVar145._0_4_ * auVar145._0_4_;
                  auVar234._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                  auVar234._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                  auVar234._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                  auVar137 = vfmadd213ps_avx512vl(auVar110,auVar145,auVar111);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar145,auVar112);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar145,auVar113);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar145,auVar114);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar145,auVar115);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar145,auVar116);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar145,auVar129);
                  auVar137 = vfmadd213ps_avx512vl(auVar137,auVar145,auVar130);
                  auVar136 = vmulps_avx512vl(auVar234,auVar145);
                  auVar136 = vmulps_avx512vl(auVar136,auVar137);
                  auVar39._8_4_ = 0xffffff82;
                  auVar39._0_8_ = 0xffffff82ffffff82;
                  auVar39._12_4_ = 0xffffff82;
                  auVar137 = vpaddd_avx512vl(auVar134,auVar39);
                  auVar137 = vcvtdq2ps_avx(auVar137);
                  auVar134 = vsubps_avx512vl(auVar137,auVar217);
                  bVar105 = (bool)((byte)uVar12 & 1);
                  auVar146._0_4_ = (uint)bVar105 * auVar134._0_4_ | (uint)!bVar105 * auVar137._0_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar146._4_4_ = (uint)bVar105 * auVar134._4_4_ | (uint)!bVar105 * auVar137._4_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar146._8_4_ = (uint)bVar105 * auVar134._8_4_ | (uint)!bVar105 * auVar137._8_4_;
                  bVar105 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar146._12_4_ =
                       (uint)bVar105 * auVar134._12_4_ | (uint)!bVar105 * auVar137._12_4_;
                  auVar137 = vfmadd231ps_avx512vl(auVar136,auVar146,auVar299);
                  auVar137 = vfmsub231ps_avx512vl(auVar137,auVar209,auVar234);
                  auVar137 = vsubps_avx512vl(auVar137,auVar145);
                  auVar137 = vfnmadd231ps_fma(auVar137,auVar221,auVar146);
                  auVar136 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar147._0_4_ =
                       (uint)bVar105 * auVar136._0_4_ |
                       (uint)!bVar105 * (int)(auVar137._0_4_ + auVar137._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar147._4_4_ =
                       (uint)bVar105 * auVar136._4_4_ |
                       (uint)!bVar105 * (int)(auVar137._4_4_ + auVar137._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar147._8_4_ =
                       (uint)bVar105 * auVar136._8_4_ |
                       (uint)!bVar105 * (int)(auVar137._8_4_ + auVar137._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar147._12_4_ =
                       (uint)bVar105 * auVar136._12_4_ |
                       (uint)!bVar105 * (int)(auVar137._12_4_ + auVar137._12_4_);
                  auVar137 = vminps_avx(auVar147,auVar200);
                  auVar136 = vmaxps_avx(auVar137,auVar204);
                  auVar134 = vfmadd213ps_fma(auVar213,auVar136,auVar209);
                  auVar316._0_4_ = (int)auVar134._0_4_;
                  auVar316._4_4_ = (int)auVar134._4_4_;
                  auVar316._8_4_ = (int)auVar134._8_4_;
                  auVar316._12_4_ = (int)auVar134._12_4_;
                  auVar137 = vcvtdq2ps_avx(auVar316);
                  uVar97 = vcmpps_avx512vl(auVar134,auVar137,1);
                  auVar134 = vsubps_avx512vl(auVar137,auVar217);
                  bVar105 = (bool)((byte)uVar97 & 1);
                  auVar148._0_4_ =
                       (float)((uint)bVar105 * auVar134._0_4_ | (uint)!bVar105 * auVar137._0_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar148._4_4_ =
                       (float)((uint)bVar105 * auVar134._4_4_ | (uint)!bVar105 * auVar137._4_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar148._8_4_ =
                       (float)((uint)bVar105 * auVar134._8_4_ | (uint)!bVar105 * auVar137._8_4_);
                  bVar105 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar148._12_4_ =
                       (float)((uint)bVar105 * auVar134._12_4_ | (uint)!bVar105 * auVar137._12_4_);
                  auVar137 = vfmsub231ps_fma(auVar136,auVar148,auVar221);
                  auVar137 = vfnmsub231ps_fma(auVar137,auVar148,auVar299);
                  auVar259._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                  auVar259._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                  auVar259._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                  auVar259._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                  auVar136 = vfmadd213ps_avx512vl(auVar107,auVar137,auVar270);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar275);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar281);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar287);
                  auVar136 = vfmadd213ps_avx512vl(auVar136,auVar137,auVar209);
                  auVar137 = vfmadd213ps_avx512vl(auVar136,auVar259,auVar137);
                  auVar136 = vaddps_avx512vl(auVar137,auVar217);
                  auVar235._0_4_ = (int)auVar148._0_4_;
                  auVar235._4_4_ = (int)auVar148._4_4_;
                  auVar235._8_4_ = (int)auVar148._8_4_;
                  auVar235._12_4_ = (int)auVar148._12_4_;
                  auVar137 = vpslld_avx(auVar235,0x17);
                  auVar137 = vpaddd_avx(auVar293,auVar137);
                  auVar136 = vfmadd213ps_fma(auVar137,auVar136,auVar217);
                  auVar137 = vrcpps_avx(auVar136);
                  auVar317._0_4_ = auVar137._0_4_ + auVar137._0_4_;
                  auVar317._4_4_ = auVar137._4_4_ + auVar137._4_4_;
                  auVar317._8_4_ = auVar137._8_4_ + auVar137._8_4_;
                  auVar317._12_4_ = auVar137._12_4_ + auVar137._12_4_;
                  auVar136 = vfmsub213ps_avx512vl(auVar136,auVar317,auVar131);
                  auVar137 = vfnmadd213ps_fma(auVar136,auVar137,auVar317);
                  auVar143 = vfmsub213ps_fma(auVar137,auVar132,auVar132);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                  auVar238._4_4_ = uVar1;
                  auVar238._0_4_ = uVar1;
                  auVar238._8_4_ = uVar1;
                  auVar238._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                  auVar132 = vfmadd213ps_avx512vl(auVar238,auVar132,auVar36);
                  auVar132 = vmaxps_avx512vl(auVar132,auVar106);
                  auVar132 = vminps_avx(auVar132,auVar217);
                  auVar143._0_4_ = auVar132._0_4_ * auVar198._0_4_;
                  auVar143._4_4_ = auVar132._4_4_ * auVar198._4_4_;
                  auVar143._8_4_ = auVar132._8_4_ * auVar198._8_4_;
                  auVar143._12_4_ = auVar132._12_4_ * auVar198._12_4_;
                }
                auVar132 = auVar143;
              }
              *pauVar93 = auVar132;
              pauVar93 = pauVar93 + 1;
            }
          }
        }
        if ((iVar3 == 4) && (_elempack == 1)) {
          local_88 = top_blob->data;
          local_90 = (void *)((long)top_blob->w * top_blob->elemsize);
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = (void *)0x0;
          if (0 < iVar99) {
            pvVar86 = pvVar84;
          }
          for (pvVar90 = (void *)0x0; pvVar10 = local_88, pvVar90 != pvVar86;
              pvVar90 = (void *)((long)pvVar90 + 1)) {
            lVar88 = (long)local_90 * (long)pvVar90;
            sVar8 = (this->weight_data_packed).cstep;
            sVar9 = (this->weight_data_packed).elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            pvVar11 = (this->weight_data_packed).data;
            for (lVar103 = 0; lVar103 <= lVar85; lVar103 = lVar103 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar198 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) +
                                            (long)pvVar90 * 4));
              }
              pfVar96 = (float *)(sVar8 * (long)pvVar90 * sVar9 + (long)pvVar11);
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                p_Var7 = this->_vptr_Convolution1D_x86_avx512[-3];
                pfVar100 = (float *)((long)local_d8.data +
                                    (long)(*(int *)(&this->field_0xdc + (long)p_Var7) *
                                          (int)lVar103 * 4) * 4 +
                                    (long)local_d8.w *
                                    CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) *
                                    uVar97);
                iVar101 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                  iVar101 = 0;
                }
                while (bVar105 = iVar101 != 0, iVar101 = iVar101 + -1, bVar105) {
                  auVar110._0_4_ = *pfVar96 * *pfVar100;
                  auVar110._4_4_ = pfVar96[1] * pfVar100[1];
                  auVar110._8_4_ = pfVar96[2] * pfVar100[2];
                  auVar110._12_4_ = pfVar96[3] * pfVar100[3];
                  auVar106 = vshufpd_avx(auVar110,auVar110,1);
                  auVar111._0_4_ = auVar106._0_4_ + auVar110._0_4_;
                  auVar111._4_4_ = auVar106._4_4_ + auVar110._4_4_;
                  auVar111._8_4_ = auVar106._8_4_ + auVar110._8_4_;
                  auVar111._12_4_ = auVar106._12_4_ + auVar110._12_4_;
                  auVar106 = vmovshdup_avx(auVar111);
                  auVar198 = ZEXT464((uint)(auVar106._0_4_ + auVar198._0_4_ + auVar111._0_4_));
                  pfVar100 = pfVar100 + (long)*(int *)(&this->field_0xd8 + (long)p_Var7) * 4;
                  pfVar96 = pfVar96 + 4;
                }
              }
              auVar106 = auVar198._0_16_;
              fVar190 = auVar198._0_4_;
              fVar191 = fVar190;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar106 = vmaxss_avx(auVar106,ZEXT416(0));
                fVar191 = auVar106._0_4_;
                break;
              case 2:
                uVar13 = vcmpss_avx512f(auVar106,ZEXT416(0),0xe);
                bVar105 = (bool)((byte)uVar13 & 1);
                fVar191 = (float)((uint)bVar105 * 0x3f800000 +
                                 (uint)!bVar105 * **(int **)(&this->field_0xf8 + (long)p_Var5)) *
                          fVar190;
                break;
              case 3:
                fVar190 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar106 = vmaxss_avx(auVar106,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var5)
                                                      ));
                fVar191 = auVar106._0_4_;
                if (fVar190 < auVar106._0_4_) {
                  fVar191 = fVar190;
                }
                break;
              case 4:
                auVar106 = vminss_avx(auVar106,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar113._8_4_ = 0x80000000;
                auVar113._0_8_ = 0x8000000080000000;
                auVar113._12_4_ = 0x80000000;
                auVar107 = vxorps_avx512vl(auVar106,auVar113);
                uVar13 = vcmpss_avx512f(auVar106,ZEXT416(0xc2b0c0a5),1);
                bVar105 = (bool)((byte)uVar13 & 1);
                fVar191 = expf((float)((uint)bVar105 * 0x42b0c0a5 + (uint)!bVar105 * auVar107._0_4_)
                              );
                fVar191 = 1.0 / (fVar191 + 1.0);
                break;
              case 5:
                fVar191 = expf(fVar190);
                fVar191 = logf(fVar191 + 1.0);
                fVar191 = tanhf(fVar191);
                fVar191 = fVar191 * fVar190;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar112._8_4_ = 0x80000000;
                auVar112._0_8_ = 0x8000000080000000;
                auVar112._12_4_ = 0x80000000;
                auVar108 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var5))[1]);
                auVar107 = vxorps_avx512vl(auVar108,auVar112);
                fVar207 = auVar107._0_4_ / fVar2;
                fVar191 = 0.0;
                if ((fVar207 <= fVar190) && (fVar191 = fVar190, fVar190 <= fVar207 + 1.0 / fVar2)) {
                  auVar106 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar106,auVar108);
                  fVar191 = auVar106._0_4_ * fVar190;
                }
              }
              *(float *)((long)pvVar10 + lVar103 * 4 + lVar88) = fVar191;
            }
          }
        }
        iVar94 = 0;
        if ((iVar3 == 1) && (iVar94 = 0, _elempack == 1)) {
          iVar3 = top_blob->w;
          sVar8 = top_blob->elemsize;
          uVar87 = 0;
          if (0 < iVar83) {
            uVar87 = (ulong)(uint)iVar83;
          }
          pvVar86 = top_blob->data;
          if (iVar99 < 1) {
            pvVar84 = (void *)0x0;
          }
          for (pvVar90 = (void *)0x0; pvVar90 != pvVar84; pvVar90 = (void *)((long)pvVar90 + 1)) {
            pp_Var6 = this->_vptr_Convolution1D_x86_avx512;
            for (lVar88 = 0; lVar88 <= lVar85; lVar88 = lVar88 + 1) {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar198 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) +
                                            (long)pvVar90 * 4));
              }
              iVar101 = *(int *)(&this->field_0xd4 + (long)p_Var5);
              puVar89 = (uint *)((long)(iVar83 * (int)pvVar90 * iVar101) * 4 +
                                *(long *)(&this->field_0x148 + (long)p_Var5));
              if (iVar101 < 1) {
                iVar101 = 0;
              }
              for (uVar97 = 0; uVar97 != uVar87; uVar97 = uVar97 + 1) {
                puVar98 = (uint *)((long)local_d8.data +
                                  (long)*(int *)(&this->field_0xdc + (long)p_Var5) *
                                  (long)(int)lVar88 * 4 +
                                  (long)local_d8.w *
                                  CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize) * uVar97
                                  );
                iVar99 = iVar101;
                while (bVar105 = iVar99 != 0, iVar99 = iVar99 + -1, bVar105) {
                  auVar106 = vfmadd231ss_fma(auVar198._0_16_,ZEXT416(*puVar89),ZEXT416(*puVar98));
                  auVar198 = ZEXT1664(auVar106);
                  puVar98 = puVar98 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                  puVar89 = puVar89 + 1;
                }
              }
              auVar106 = auVar198._0_16_;
              fVar190 = auVar198._0_4_;
              fVar191 = fVar190;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar106 = vmaxss_avx(auVar106,ZEXT416(0));
                fVar191 = auVar106._0_4_;
                break;
              case 2:
                uVar13 = vcmpss_avx512f(auVar106,ZEXT416(0),0xe);
                bVar105 = (bool)((byte)uVar13 & 1);
                fVar191 = (float)((uint)bVar105 * 0x3f800000 +
                                 (uint)!bVar105 * **(int **)(&this->field_0xf8 + (long)p_Var5)) *
                          fVar190;
                break;
              case 3:
                fVar190 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar106 = vmaxss_avx(auVar106,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var5)
                                                      ));
                fVar191 = auVar106._0_4_;
                if (fVar190 < auVar106._0_4_) {
                  fVar191 = fVar190;
                }
                break;
              case 4:
                auVar106 = vminss_avx(auVar106,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar115._8_4_ = 0x80000000;
                auVar115._0_8_ = 0x8000000080000000;
                auVar115._12_4_ = 0x80000000;
                auVar107 = vxorps_avx512vl(auVar106,auVar115);
                uVar13 = vcmpss_avx512f(auVar106,ZEXT416(0xc2b0c0a5),1);
                bVar105 = (bool)((byte)uVar13 & 1);
                fVar191 = expf((float)((uint)bVar105 * 0x42b0c0a5 + (uint)!bVar105 * auVar107._0_4_)
                              );
                fVar191 = 1.0 / (fVar191 + 1.0);
                break;
              case 5:
                fVar191 = expf(fVar190);
                fVar191 = logf(fVar191 + 1.0);
                fVar191 = tanhf(fVar191);
                fVar191 = fVar191 * fVar190;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar114._8_4_ = 0x80000000;
                auVar114._0_8_ = 0x8000000080000000;
                auVar114._12_4_ = 0x80000000;
                auVar108 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var5))[1]);
                auVar107 = vxorps_avx512vl(auVar108,auVar114);
                fVar207 = auVar107._0_4_ / fVar2;
                fVar191 = 0.0;
                if ((fVar207 <= fVar190) && (fVar191 = fVar190, fVar190 <= fVar207 + 1.0 / fVar2)) {
                  auVar106 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar106,auVar108);
                  fVar191 = auVar106._0_4_ * fVar190;
                }
              }
              *(float *)((long)pvVar86 + lVar88 * 4 + (long)iVar3 * sVar8 * (long)pvVar90) = fVar191
              ;
            }
          }
          iVar94 = 0;
        }
      }
    }
    piVar82 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar82 != (int *)0x0) {
      LOCK();
      *piVar82 = *piVar82 + -1;
      UNLOCK();
      if (*piVar82 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          free(local_d8.data);
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar94;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}